

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  byte bVar57;
  long lVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  Geometry *pGVar62;
  uint uVar63;
  Geometry *geometry;
  long lVar64;
  ulong uVar65;
  byte bVar66;
  ulong uVar67;
  ulong uVar68;
  float fVar69;
  float fVar70;
  float fVar117;
  float fVar119;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar118;
  float fVar120;
  float fVar122;
  float fVar123;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar121;
  float fVar124;
  float fVar125;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined4 uVar126;
  float fVar135;
  float fVar136;
  vint4 bi_2;
  undefined1 auVar127 [16];
  float fVar137;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined8 uVar138;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 ai_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar167;
  float fVar170;
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_610 [16];
  ulong local_5f8;
  undefined1 local_5f0 [16];
  Geometry *local_5e0;
  Precalculations *local_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [16];
  LinearSpace3fa *local_490;
  Primitive *local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar68 = (ulong)(byte)PVar6;
  lVar23 = uVar68 * 0x25;
  fVar149 = *(float *)(prim + lVar23 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + lVar23 + 6));
  auVar150._0_4_ = fVar149 * auVar75._0_4_;
  auVar150._4_4_ = fVar149 * auVar75._4_4_;
  auVar150._8_4_ = fVar149 * auVar75._8_4_;
  auVar150._12_4_ = fVar149 * auVar75._12_4_;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar127._0_4_ = fVar149 * auVar74._0_4_;
  auVar127._4_4_ = fVar149 * auVar74._4_4_;
  auVar127._8_4_ = fVar149 * auVar74._8_4_;
  auVar127._12_4_ = fVar149 * auVar74._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar68 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar162._4_4_ = auVar127._0_4_;
  auVar162._0_4_ = auVar127._0_4_;
  auVar162._8_4_ = auVar127._0_4_;
  auVar162._12_4_ = auVar127._0_4_;
  auVar77 = vshufps_avx(auVar127,auVar127,0x55);
  auVar78 = vshufps_avx(auVar127,auVar127,0xaa);
  fVar149 = auVar78._0_4_;
  auVar144._0_4_ = fVar149 * auVar76._0_4_;
  fVar135 = auVar78._4_4_;
  auVar144._4_4_ = fVar135 * auVar76._4_4_;
  fVar136 = auVar78._8_4_;
  auVar144._8_4_ = fVar136 * auVar76._8_4_;
  fVar137 = auVar78._12_4_;
  auVar144._12_4_ = fVar137 * auVar76._12_4_;
  auVar139._0_4_ = auVar18._0_4_ * fVar149;
  auVar139._4_4_ = auVar18._4_4_ * fVar135;
  auVar139._8_4_ = auVar18._8_4_ * fVar136;
  auVar139._12_4_ = auVar18._12_4_ * fVar137;
  auVar128._0_4_ = auVar21._0_4_ * fVar149;
  auVar128._4_4_ = auVar21._4_4_ * fVar135;
  auVar128._8_4_ = auVar21._8_4_ * fVar136;
  auVar128._12_4_ = auVar21._12_4_ * fVar137;
  auVar78 = vfmadd231ps_fma(auVar144,auVar77,auVar74);
  auVar25 = vfmadd231ps_fma(auVar139,auVar77,auVar17);
  auVar77 = vfmadd231ps_fma(auVar128,auVar20,auVar77);
  auVar26 = vfmadd231ps_fma(auVar78,auVar162,auVar75);
  auVar25 = vfmadd231ps_fma(auVar25,auVar162,auVar16);
  auVar79 = vfmadd231ps_fma(auVar77,auVar19,auVar162);
  auVar182._4_4_ = auVar150._0_4_;
  auVar182._0_4_ = auVar150._0_4_;
  auVar182._8_4_ = auVar150._0_4_;
  auVar182._12_4_ = auVar150._0_4_;
  auVar77 = vshufps_avx(auVar150,auVar150,0x55);
  auVar78 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar149 = auVar78._0_4_;
  auVar163._0_4_ = fVar149 * auVar76._0_4_;
  fVar135 = auVar78._4_4_;
  auVar163._4_4_ = fVar135 * auVar76._4_4_;
  fVar136 = auVar78._8_4_;
  auVar163._8_4_ = fVar136 * auVar76._8_4_;
  fVar137 = auVar78._12_4_;
  auVar163._12_4_ = fVar137 * auVar76._12_4_;
  auVar156._0_4_ = auVar18._0_4_ * fVar149;
  auVar156._4_4_ = auVar18._4_4_ * fVar135;
  auVar156._8_4_ = auVar18._8_4_ * fVar136;
  auVar156._12_4_ = auVar18._12_4_ * fVar137;
  auVar151._0_4_ = auVar21._0_4_ * fVar149;
  auVar151._4_4_ = auVar21._4_4_ * fVar135;
  auVar151._8_4_ = auVar21._8_4_ * fVar136;
  auVar151._12_4_ = auVar21._12_4_ * fVar137;
  auVar74 = vfmadd231ps_fma(auVar163,auVar77,auVar74);
  auVar76 = vfmadd231ps_fma(auVar156,auVar77,auVar17);
  auVar17 = vfmadd231ps_fma(auVar151,auVar77,auVar20);
  auVar27 = vfmadd231ps_fma(auVar74,auVar182,auVar75);
  auVar127 = vfmadd231ps_fma(auVar76,auVar182,auVar16);
  auVar174._8_4_ = 0x7fffffff;
  auVar174._0_8_ = 0x7fffffff7fffffff;
  auVar174._12_4_ = 0x7fffffff;
  auVar128 = vfmadd231ps_fma(auVar17,auVar182,auVar19);
  auVar75 = vandps_avx(auVar174,auVar26);
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar75,auVar171,1);
  bVar10 = (bool)((byte)uVar65 & 1);
  auVar71._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar26._0_4_;
  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar26._4_4_;
  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar26._8_4_;
  bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar26._12_4_;
  auVar75 = vandps_avx(auVar174,auVar25);
  uVar65 = vcmpps_avx512vl(auVar75,auVar171,1);
  bVar10 = (bool)((byte)uVar65 & 1);
  auVar72._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._0_4_;
  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._4_4_;
  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._8_4_;
  bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar25._12_4_;
  auVar75 = vandps_avx(auVar174,auVar79);
  uVar65 = vcmpps_avx512vl(auVar75,auVar171,1);
  bVar10 = (bool)((byte)uVar65 & 1);
  auVar73._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._0_4_;
  bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._4_4_;
  bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._8_4_;
  bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar79._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar71);
  auVar172._8_4_ = 0x3f800000;
  auVar172._0_8_ = 0x3f8000003f800000;
  auVar172._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar71,auVar74,auVar172);
  auVar26 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar75 = vfnmadd213ps_fma(auVar72,auVar74,auVar172);
  auVar79 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar75 = vfnmadd213ps_fma(auVar73,auVar74,auVar172);
  auVar24 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  fVar149 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  auVar168._4_4_ = fVar149;
  auVar168._0_4_ = fVar149;
  auVar168._8_4_ = fVar149;
  auVar168._12_4_ = fVar149;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar16 = vsubps_avx(auVar74,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar74 = vpmovsxwd_avx(auVar76);
  auVar76 = vfmadd213ps_fma(auVar16,auVar168,auVar75);
  auVar75 = vcvtdq2ps_avx(auVar74);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar74 = vpmovsxwd_avx(auVar16);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar16 = vfmadd213ps_fma(auVar74,auVar168,auVar75);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar75 = vpmovsxwd_avx(auVar17);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar65 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar65 + 6);
  auVar74 = vpmovsxwd_avx(auVar18);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar17 = vfmadd213ps_fma(auVar74,auVar168,auVar75);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar75 = vpmovsxwd_avx(auVar19);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar74 = vpmovsxwd_avx(auVar20);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar18 = vfmadd213ps_fma(auVar74,auVar168,auVar75);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar75 = vpmovsxwd_avx(auVar21);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar74 = vpmovsxwd_avx(auVar77);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar19 = vfmadd213ps_fma(auVar74,auVar168,auVar75);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar68) + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar74 = vpmovsxwd_avx(auVar25);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar74 = vfmadd213ps_fma(auVar74,auVar168,auVar75);
  auVar75 = vsubps_avx(auVar76,auVar27);
  auVar169._0_4_ = auVar26._0_4_ * auVar75._0_4_;
  auVar169._4_4_ = auVar26._4_4_ * auVar75._4_4_;
  auVar169._8_4_ = auVar26._8_4_ * auVar75._8_4_;
  auVar169._12_4_ = auVar26._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar16,auVar27);
  auVar145._0_4_ = auVar26._0_4_ * auVar75._0_4_;
  auVar145._4_4_ = auVar26._4_4_ * auVar75._4_4_;
  auVar145._8_4_ = auVar26._8_4_ * auVar75._8_4_;
  auVar145._12_4_ = auVar26._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar17,auVar127);
  auVar164._0_4_ = auVar79._0_4_ * auVar75._0_4_;
  auVar164._4_4_ = auVar79._4_4_ * auVar75._4_4_;
  auVar164._8_4_ = auVar79._8_4_ * auVar75._8_4_;
  auVar164._12_4_ = auVar79._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar18,auVar127);
  auVar140._0_4_ = auVar79._0_4_ * auVar75._0_4_;
  auVar140._4_4_ = auVar79._4_4_ * auVar75._4_4_;
  auVar140._8_4_ = auVar79._8_4_ * auVar75._8_4_;
  auVar140._12_4_ = auVar79._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar19,auVar128);
  auVar157._0_4_ = auVar24._0_4_ * auVar75._0_4_;
  auVar157._4_4_ = auVar24._4_4_ * auVar75._4_4_;
  auVar157._8_4_ = auVar24._8_4_ * auVar75._8_4_;
  auVar157._12_4_ = auVar24._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar74,auVar128);
  auVar129._0_4_ = auVar24._0_4_ * auVar75._0_4_;
  auVar129._4_4_ = auVar24._4_4_ * auVar75._4_4_;
  auVar129._8_4_ = auVar24._8_4_ * auVar75._8_4_;
  auVar129._12_4_ = auVar24._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar169,auVar145);
  auVar74 = vpminsd_avx(auVar164,auVar140);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74 = vpminsd_avx(auVar157,auVar129);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar26._4_4_ = uVar126;
  auVar26._0_4_ = uVar126;
  auVar26._8_4_ = uVar126;
  auVar26._12_4_ = uVar126;
  auVar74 = vmaxps_avx512vl(auVar74,auVar26);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar79._8_4_ = 0x3f7ffffa;
  auVar79._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar79._12_4_ = 0x3f7ffffa;
  local_290 = vmulps_avx512vl(auVar75,auVar79);
  auVar75 = vpmaxsd_avx(auVar169,auVar145);
  auVar74 = vpmaxsd_avx(auVar164,auVar140);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar74 = vpmaxsd_avx(auVar157,auVar129);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar24._4_4_ = uVar126;
  auVar24._0_4_ = uVar126;
  auVar24._8_4_ = uVar126;
  auVar24._12_4_ = uVar126;
  auVar74 = vminps_avx512vl(auVar74,auVar24);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar27._8_4_ = 0x3f800003;
  auVar27._0_8_ = 0x3f8000033f800003;
  auVar27._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar27);
  auVar74 = vpbroadcastd_avx512vl();
  uVar138 = vcmpps_avx512vl(local_290,auVar75,2);
  uVar65 = vpcmpgtd_avx512vl(auVar74,_DAT_01f7fcf0);
  uVar65 = ((byte)uVar138 & 0xf) & uVar65;
  if ((char)uVar65 == '\0') {
    bVar66 = 0;
  }
  else {
    local_490 = pre->ray_space + k;
    local_3c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5d8 = pre;
    local_488 = prim;
    do {
      lVar23 = 0;
      for (uVar68 = uVar65; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_5f8 = (ulong)*(uint *)(local_488 + 2);
      pGVar62 = (context->scene->geometries).items[local_5f8].ptr;
      local_540._0_8_ = CONCAT44(0,*(uint *)(local_488 + lVar23 * 4 + 6));
      uVar68 = (ulong)*(uint *)(*(long *)&pGVar62->field_0x58 +
                               CONCAT44(0,*(uint *)(local_488 + lVar23 * 4 + 6)) *
                               pGVar62[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar149 = (pGVar62->time_range).lower;
      fVar149 = pGVar62->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar149) /
                ((pGVar62->time_range).upper - fVar149));
      auVar75 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
      auVar75 = vminss_avx(auVar75,ZEXT416((uint)(pGVar62->fnumTimeSegments + -1.0)));
      auVar75 = vmaxss_avx(ZEXT816(0) << 0x20,auVar75);
      fVar149 = fVar149 - auVar75._0_4_;
      _Var8 = pGVar62[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar59 = (long)(int)auVar75._0_4_ * 0x38;
      lVar23 = *(long *)(_Var8 + 0x10 + lVar59);
      lVar64 = *(long *)(_Var8 + 0x38 + lVar59);
      lVar58 = *(long *)(_Var8 + 0x48 + lVar59);
      auVar141._4_4_ = fVar149;
      auVar141._0_4_ = fVar149;
      auVar141._8_4_ = fVar149;
      auVar141._12_4_ = fVar149;
      pfVar3 = (float *)(lVar64 + uVar68 * lVar58);
      auVar175._0_4_ = fVar149 * *pfVar3;
      auVar175._4_4_ = fVar149 * pfVar3[1];
      auVar175._8_4_ = fVar149 * pfVar3[2];
      auVar175._12_4_ = fVar149 * pfVar3[3];
      pfVar3 = (float *)(lVar64 + (uVar68 + 1) * lVar58);
      auVar176._0_4_ = fVar149 * *pfVar3;
      auVar176._4_4_ = fVar149 * pfVar3[1];
      auVar176._8_4_ = fVar149 * pfVar3[2];
      auVar176._12_4_ = fVar149 * pfVar3[3];
      uVar60 = (uVar68 + 2) * lVar58;
      auVar75 = vmulps_avx512vl(auVar141,*(undefined1 (*) [16])(lVar64 + uVar60));
      auVar74 = vmulps_avx512vl(auVar141,*(undefined1 (*) [16])(lVar64 + lVar58 * (uVar68 + 3)));
      lVar64 = *(long *)(_Var8 + lVar59);
      fVar149 = 1.0 - fVar149;
      auVar130._4_4_ = fVar149;
      auVar130._0_4_ = fVar149;
      auVar130._8_4_ = fVar149;
      auVar130._12_4_ = fVar149;
      local_510 = vfmadd231ps_fma(auVar175,auVar130,*(undefined1 (*) [16])(lVar64 + lVar23 * uVar68)
                                 );
      local_520 = vfmadd231ps_fma(auVar176,auVar130,
                                  *(undefined1 (*) [16])(lVar64 + lVar23 * (uVar68 + 1)));
      local_530 = vfmadd231ps_avx512vl
                            (auVar75,auVar130,*(undefined1 (*) [16])(lVar64 + lVar23 * (uVar68 + 2))
                            );
      _local_3b0 = vfmadd231ps_avx512vl
                             (auVar74,auVar130,
                              *(undefined1 (*) [16])(lVar64 + lVar23 * (uVar68 + 3)));
      iVar7 = (int)pGVar62[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar23 = (long)iVar7 * 0x44;
      auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar76 = vsubps_avx(local_510,auVar75);
      uVar126 = auVar76._0_4_;
      auVar146._4_4_ = uVar126;
      auVar146._0_4_ = uVar126;
      auVar146._8_4_ = uVar126;
      auVar146._12_4_ = uVar126;
      auVar74 = vshufps_avx(auVar76,auVar76,0x55);
      aVar4 = (local_490->vx).field_0;
      aVar5 = (local_490->vy).field_0;
      fVar149 = (local_490->vz).field_0.m128[0];
      fVar135 = *(float *)((long)&(local_490->vz).field_0 + 4);
      fVar136 = *(float *)((long)&(local_490->vz).field_0 + 8);
      fVar137 = *(float *)((long)&(local_490->vz).field_0 + 0xc);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar178._0_4_ = fVar149 * auVar76._0_4_;
      auVar178._4_4_ = fVar135 * auVar76._4_4_;
      auVar178._8_4_ = fVar136 * auVar76._8_4_;
      auVar178._12_4_ = fVar137 * auVar76._12_4_;
      auVar74 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar74);
      auVar16 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar4,auVar146);
      auVar76 = vsubps_avx(local_520,auVar75);
      uVar126 = auVar76._0_4_;
      auVar147._4_4_ = uVar126;
      auVar147._0_4_ = uVar126;
      auVar147._8_4_ = uVar126;
      auVar147._12_4_ = uVar126;
      auVar74 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar179._0_4_ = fVar149 * auVar76._0_4_;
      auVar179._4_4_ = fVar135 * auVar76._4_4_;
      auVar179._8_4_ = fVar136 * auVar76._8_4_;
      auVar179._12_4_ = fVar137 * auVar76._12_4_;
      auVar74 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar74);
      auVar17 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar4,auVar147);
      auVar76 = vsubps_avx512vl(local_530,auVar75);
      uVar126 = auVar76._0_4_;
      auVar148._4_4_ = uVar126;
      auVar148._0_4_ = uVar126;
      auVar148._8_4_ = uVar126;
      auVar148._12_4_ = uVar126;
      auVar74 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar180._0_4_ = fVar149 * auVar76._0_4_;
      auVar180._4_4_ = fVar135 * auVar76._4_4_;
      auVar180._8_4_ = fVar136 * auVar76._8_4_;
      auVar180._12_4_ = fVar137 * auVar76._12_4_;
      auVar74 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar74);
      auVar76 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar4,auVar148);
      auVar74 = vsubps_avx512vl(_local_3b0,auVar75);
      uVar126 = auVar74._0_4_;
      auVar142._4_4_ = uVar126;
      auVar142._0_4_ = uVar126;
      auVar142._8_4_ = uVar126;
      auVar142._12_4_ = uVar126;
      auVar75 = vshufps_avx(auVar74,auVar74,0x55);
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar185._0_4_ = fVar149 * auVar74._0_4_;
      auVar185._4_4_ = fVar135 * auVar74._4_4_;
      auVar185._8_4_ = fVar136 * auVar74._8_4_;
      auVar185._12_4_ = fVar137 * auVar74._12_4_;
      auVar75 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar75);
      auVar18 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar142);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      uVar126 = auVar16._0_4_;
      local_420._4_4_ = uVar126;
      local_420._0_4_ = uVar126;
      local_420._8_4_ = uVar126;
      local_420._12_4_ = uVar126;
      local_420._16_4_ = uVar126;
      local_420._20_4_ = uVar126;
      local_420._24_4_ = uVar126;
      local_420._28_4_ = uVar126;
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      auVar80._8_4_ = 1;
      auVar80._0_8_ = 0x100000001;
      auVar80._12_4_ = 1;
      auVar80._16_4_ = 1;
      auVar80._20_4_ = 1;
      auVar80._24_4_ = 1;
      auVar80._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar80,ZEXT1632(auVar16));
      uVar126 = auVar17._0_4_;
      local_580._4_4_ = uVar126;
      local_580._0_4_ = uVar126;
      local_580._8_4_ = uVar126;
      local_580._12_4_ = uVar126;
      local_580._16_4_ = uVar126;
      local_580._20_4_ = uVar126;
      local_580._24_4_ = uVar126;
      local_580._28_4_ = uVar126;
      local_5a0 = vpermps_avx512vl(auVar80,ZEXT1632(auVar17));
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      local_4c0 = vbroadcastss_avx512vl(auVar76);
      local_440 = vpermps_avx512vl(auVar80,ZEXT1632(auVar76));
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar18);
      auVar197 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar80,ZEXT1632(auVar18));
      auVar199 = ZEXT3264(local_500);
      auVar80 = vmulps_avx512vl(local_4e0,auVar92);
      auVar81 = vmulps_avx512vl(local_500,auVar92);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar93,local_4c0);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar93,local_440);
      auVar75 = vfmadd231ps_fma(auVar80,auVar97,local_580);
      auVar82 = vfmadd231ps_avx512vl(auVar81,auVar97,local_5a0);
      auVar83 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar95,local_420);
      auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar81 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      auVar84 = vfmadd231ps_avx512vl(auVar82,auVar95,local_3e0);
      auVar82 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0xd8c);
      auVar85 = vmulps_avx512vl(local_4e0,auVar82);
      auVar86 = vmulps_avx512vl(local_500,auVar82);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,local_4c0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,local_440);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,local_580);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,local_5a0);
      auVar19 = vfmadd231ps_fma(auVar85,auVar80,local_420);
      auVar20 = vfmadd231ps_fma(auVar86,auVar80,local_3e0);
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar19),auVar83);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar20),auVar84);
      auVar85 = vmulps_avx512vl(auVar84,auVar86);
      auVar88 = vmulps_avx512vl(auVar83,auVar87);
      auVar85 = vsubps_avx512vl(auVar85,auVar88);
      auVar75 = vshufps_avx(local_510,local_510,0xff);
      uVar138 = auVar75._0_8_;
      local_80._8_8_ = uVar138;
      local_80._0_8_ = uVar138;
      local_80._16_8_ = uVar138;
      local_80._24_8_ = uVar138;
      auVar75 = vshufps_avx(local_520,local_520,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar75);
      auVar75 = vshufps_avx512vl(local_530,local_530,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar75);
      auVar75 = vshufps_avx512vl(_local_3b0,_local_3b0,0xff);
      uVar138 = auVar75._0_8_;
      register0x000012c8 = uVar138;
      local_e0 = uVar138;
      register0x000012d0 = uVar138;
      register0x000012d8 = uVar138;
      auVar88 = vmulps_avx512vl(_local_e0,auVar92);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar97,local_a0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,local_80);
      auVar89 = vmulps_avx512vl(_local_e0,auVar82);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,local_c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar81,local_a0);
      auVar21 = vfmadd231ps_fma(auVar89,auVar80,local_80);
      auVar89 = vmulps_avx512vl(auVar87,auVar87);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar86);
      auVar90 = vmaxps_avx512vl(auVar88,ZEXT1632(auVar21));
      auVar90 = vmulps_avx512vl(auVar90,auVar90);
      auVar89 = vmulps_avx512vl(auVar90,auVar89);
      auVar85 = vmulps_avx512vl(auVar85,auVar85);
      uVar138 = vcmpps_avx512vl(auVar85,auVar89,2);
      auVar75 = vblendps_avx(auVar16,local_510,8);
      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar74 = vandps_avx512vl(auVar75,auVar77);
      auVar75 = vblendps_avx(auVar17,local_520,8);
      auVar75 = vandps_avx512vl(auVar75,auVar77);
      auVar74 = vmaxps_avx(auVar74,auVar75);
      auVar75 = vblendps_avx(auVar76,local_530,8);
      auVar78 = vandps_avx512vl(auVar75,auVar77);
      auVar75 = vblendps_avx(auVar18,_local_3b0,8);
      auVar75 = vandps_avx512vl(auVar75,auVar77);
      auVar75 = vmaxps_avx(auVar78,auVar75);
      auVar75 = vmaxps_avx(auVar74,auVar75);
      auVar74 = vmovshdup_avx(auVar75);
      auVar74 = vmaxss_avx(auVar74,auVar75);
      auVar75 = vshufpd_avx(auVar75,auVar75,1);
      auVar75 = vmaxss_avx(auVar75,auVar74);
      local_550 = vcvtsi2ss_avx512f(_local_3b0,iVar7);
      auVar89._0_4_ = local_550._0_4_;
      auVar89._4_4_ = auVar89._0_4_;
      auVar89._8_4_ = auVar89._0_4_;
      auVar89._12_4_ = auVar89._0_4_;
      auVar89._16_4_ = auVar89._0_4_;
      auVar89._20_4_ = auVar89._0_4_;
      auVar89._24_4_ = auVar89._0_4_;
      auVar89._28_4_ = auVar89._0_4_;
      uVar22 = vcmpps_avx512vl(auVar89,_DAT_01faff40,0xe);
      bVar66 = (byte)uVar138 & (byte)uVar22;
      local_380 = auVar75._0_4_ * 4.7683716e-07;
      auVar85._8_4_ = 2;
      auVar85._0_8_ = 0x200000002;
      auVar85._12_4_ = 2;
      auVar85._16_4_ = 2;
      auVar85._20_4_ = 2;
      auVar85._24_4_ = 2;
      auVar85._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar85,ZEXT1632(auVar16));
      local_120 = vpermps_avx512vl(auVar85,ZEXT1632(auVar17));
      local_140 = vpermps_avx512vl(auVar85,ZEXT1632(auVar76));
      auVar85 = vpermps_avx2(auVar85,ZEXT1632(auVar18));
      uVar63 = *(uint *)(ray + k * 4 + 0x30);
      auVar74 = auVar86._0_16_;
      auVar75 = ZEXT416((uint)local_380);
      if (bVar66 == 0) {
        uVar60 = 0;
        auVar75 = vxorps_avx512vl(auVar74,auVar74);
        auVar195 = ZEXT1664(auVar75);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar192 = ZEXT3264(auVar95);
        auVar193 = ZEXT3264(local_420);
        auVar194 = ZEXT3264(local_3e0);
        auVar191 = ZEXT3264(local_580);
        auVar190 = ZEXT3264(local_5a0);
        auVar196 = ZEXT3264(local_4c0);
        auVar198 = ZEXT3264(local_440);
      }
      else {
        local_480._0_16_ = ZEXT416(uVar63);
        auVar82 = vmulps_avx512vl(auVar85,auVar82);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar82);
        auVar81 = vfmadd213ps_avx512vl(auVar81,local_120,auVar91);
        auVar90 = vfmadd213ps_avx512vl(auVar80,local_100,auVar81);
        auVar92 = vmulps_avx512vl(auVar85,auVar92);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
        auVar81 = vfmadd213ps_avx512vl(auVar97,local_120,auVar93);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        auVar80 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1f9c);
        auVar94 = vfmadd213ps_avx512vl(auVar95,local_100,auVar81);
        auVar95 = vmulps_avx512vl(local_4e0,auVar80);
        auVar81 = vmulps_avx512vl(local_500,auVar80);
        auVar181._0_4_ = auVar85._0_4_ * auVar80._0_4_;
        auVar181._4_4_ = auVar85._4_4_ * auVar80._4_4_;
        auVar181._8_4_ = auVar85._8_4_ * auVar80._8_4_;
        auVar181._12_4_ = auVar85._12_4_ * auVar80._12_4_;
        auVar181._16_4_ = auVar85._16_4_ * auVar80._16_4_;
        auVar181._20_4_ = auVar85._20_4_ * auVar80._20_4_;
        auVar181._24_4_ = auVar85._24_4_ * auVar80._24_4_;
        auVar181._28_4_ = 0;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_4c0);
        auVar80 = vfmadd231ps_avx512vl(auVar81,auVar92,local_440);
        auVar92 = vfmadd231ps_avx512vl(auVar181,local_140,auVar92);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_580);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar93,local_5a0);
        auVar81 = vfmadd231ps_avx512vl(auVar92,local_120,auVar93);
        auVar91 = vfmadd231ps_avx512vl(auVar95,auVar97,local_420);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,local_3e0);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1f9c);
        auVar81 = vfmadd231ps_avx512vl(auVar81,local_100,auVar97);
        auVar82 = vmulps_avx512vl(local_4e0,auVar92);
        auVar96 = vmulps_avx512vl(local_500,auVar92);
        auVar97._4_4_ = auVar85._4_4_ * auVar92._4_4_;
        auVar97._0_4_ = auVar85._0_4_ * auVar92._0_4_;
        auVar97._8_4_ = auVar85._8_4_ * auVar92._8_4_;
        auVar97._12_4_ = auVar85._12_4_ * auVar92._12_4_;
        auVar97._16_4_ = auVar85._16_4_ * auVar92._16_4_;
        auVar97._20_4_ = auVar85._20_4_ * auVar92._20_4_;
        auVar97._24_4_ = auVar85._24_4_ * auVar92._24_4_;
        auVar97._28_4_ = auVar92._28_4_;
        auVar92 = vfmadd231ps_avx512vl(auVar82,auVar93,local_4c0);
        auVar82 = vfmadd231ps_avx512vl(auVar96,auVar93,local_440);
        auVar93 = vfmadd231ps_avx512vl(auVar97,local_140,auVar93);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,local_580);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar97,local_5a0);
        auVar97 = vfmadd231ps_avx512vl(auVar93,local_120,auVar97);
        auVar93 = vfmadd231ps_avx512vl(auVar92,auVar95,local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar82,auVar95,local_3e0);
        auVar82 = vfmadd231ps_avx512vl(auVar97,local_100,auVar95);
        auVar186._8_4_ = 0x7fffffff;
        auVar186._0_8_ = 0x7fffffff7fffffff;
        auVar186._12_4_ = 0x7fffffff;
        auVar186._16_4_ = 0x7fffffff;
        auVar186._20_4_ = 0x7fffffff;
        auVar186._24_4_ = 0x7fffffff;
        auVar186._28_4_ = 0x7fffffff;
        auVar95 = vandps_avx(auVar91,auVar186);
        auVar97 = vandps_avx(auVar80,auVar186);
        auVar97 = vmaxps_avx(auVar95,auVar97);
        auVar95 = vandps_avx(auVar81,auVar186);
        auVar95 = vmaxps_avx(auVar97,auVar95);
        auVar81 = vbroadcastss_avx512vl(auVar75);
        uVar68 = vcmpps_avx512vl(auVar95,auVar81,1);
        bVar10 = (bool)((byte)uVar68 & 1);
        auVar96._0_4_ = (float)((uint)bVar10 * auVar86._0_4_ | (uint)!bVar10 * auVar91._0_4_);
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar10 * auVar86._4_4_ | (uint)!bVar10 * auVar91._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar10 * auVar86._8_4_ | (uint)!bVar10 * auVar91._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar10 * auVar86._12_4_ | (uint)!bVar10 * auVar91._12_4_);
        bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar10 * auVar86._16_4_ | (uint)!bVar10 * auVar91._16_4_);
        bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar10 * auVar86._20_4_ | (uint)!bVar10 * auVar91._20_4_);
        bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar10 * auVar86._24_4_ | (uint)!bVar10 * auVar91._24_4_);
        bVar10 = SUB81(uVar68 >> 7,0);
        auVar96._28_4_ = (uint)bVar10 * auVar86._28_4_ | (uint)!bVar10 * auVar91._28_4_;
        bVar10 = (bool)((byte)uVar68 & 1);
        auVar98._0_4_ = (float)((uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar80._0_4_);
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar80._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar80._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar80._12_4_);
        bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar10 * auVar87._16_4_ | (uint)!bVar10 * auVar80._16_4_);
        bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar10 * auVar87._20_4_ | (uint)!bVar10 * auVar80._20_4_);
        bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar10 * auVar87._24_4_ | (uint)!bVar10 * auVar80._24_4_);
        bVar10 = SUB81(uVar68 >> 7,0);
        auVar98._28_4_ = (uint)bVar10 * auVar87._28_4_ | (uint)!bVar10 * auVar80._28_4_;
        auVar95 = vandps_avx(auVar186,auVar93);
        auVar97 = vandps_avx(auVar92,auVar186);
        auVar97 = vmaxps_avx(auVar95,auVar97);
        auVar95 = vandps_avx(auVar82,auVar186);
        auVar95 = vmaxps_avx(auVar97,auVar95);
        uVar68 = vcmpps_avx512vl(auVar95,auVar81,1);
        bVar10 = (bool)((byte)uVar68 & 1);
        auVar99._0_4_ = (float)((uint)bVar10 * auVar86._0_4_ | (uint)!bVar10 * auVar93._0_4_);
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar10 * auVar86._4_4_ | (uint)!bVar10 * auVar93._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar10 * auVar86._8_4_ | (uint)!bVar10 * auVar93._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar10 * auVar86._12_4_ | (uint)!bVar10 * auVar93._12_4_);
        bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar10 * auVar86._16_4_ | (uint)!bVar10 * auVar93._16_4_);
        bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar10 * auVar86._20_4_ | (uint)!bVar10 * auVar93._20_4_);
        bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar10 * auVar86._24_4_ | (uint)!bVar10 * auVar93._24_4_);
        bVar10 = SUB81(uVar68 >> 7,0);
        auVar99._28_4_ = (uint)bVar10 * auVar86._28_4_ | (uint)!bVar10 * auVar93._28_4_;
        bVar10 = (bool)((byte)uVar68 & 1);
        auVar100._0_4_ = (float)((uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar92._0_4_);
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar92._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar92._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar92._12_4_);
        bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar10 * auVar87._16_4_ | (uint)!bVar10 * auVar92._16_4_);
        bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar10 * auVar87._20_4_ | (uint)!bVar10 * auVar92._20_4_);
        bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar10 * auVar87._24_4_ | (uint)!bVar10 * auVar92._24_4_);
        bVar10 = SUB81(uVar68 >> 7,0);
        auVar100._28_4_ = (uint)bVar10 * auVar87._28_4_ | (uint)!bVar10 * auVar92._28_4_;
        auVar79 = vxorps_avx512vl(auVar74,auVar74);
        auVar195 = ZEXT1664(auVar79);
        auVar95 = vfmadd213ps_avx512vl(auVar96,auVar96,ZEXT1632(auVar79));
        auVar74 = vfmadd231ps_fma(auVar95,auVar98,auVar98);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
        fVar149 = auVar97._0_4_;
        fVar135 = auVar97._4_4_;
        fVar136 = auVar97._8_4_;
        fVar137 = auVar97._12_4_;
        fVar167 = auVar97._16_4_;
        fVar170 = auVar97._20_4_;
        fVar69 = auVar97._24_4_;
        auVar95._4_4_ = fVar135 * fVar135 * fVar135 * auVar74._4_4_ * -0.5;
        auVar95._0_4_ = fVar149 * fVar149 * fVar149 * auVar74._0_4_ * -0.5;
        auVar95._8_4_ = fVar136 * fVar136 * fVar136 * auVar74._8_4_ * -0.5;
        auVar95._12_4_ = fVar137 * fVar137 * fVar137 * auVar74._12_4_ * -0.5;
        auVar95._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar95._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar95._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
        auVar95._28_4_ = auVar82._28_4_;
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar80,auVar97);
        auVar93._4_4_ = auVar98._4_4_ * auVar95._4_4_;
        auVar93._0_4_ = auVar98._0_4_ * auVar95._0_4_;
        auVar93._8_4_ = auVar98._8_4_ * auVar95._8_4_;
        auVar93._12_4_ = auVar98._12_4_ * auVar95._12_4_;
        auVar93._16_4_ = auVar98._16_4_ * auVar95._16_4_;
        auVar93._20_4_ = auVar98._20_4_ * auVar95._20_4_;
        auVar93._24_4_ = auVar98._24_4_ * auVar95._24_4_;
        auVar93._28_4_ = 0;
        auVar92._4_4_ = auVar95._4_4_ * -auVar96._4_4_;
        auVar92._0_4_ = auVar95._0_4_ * -auVar96._0_4_;
        auVar92._8_4_ = auVar95._8_4_ * -auVar96._8_4_;
        auVar92._12_4_ = auVar95._12_4_ * -auVar96._12_4_;
        auVar92._16_4_ = auVar95._16_4_ * -auVar96._16_4_;
        auVar92._20_4_ = auVar95._20_4_ * -auVar96._20_4_;
        auVar92._24_4_ = auVar95._24_4_ * -auVar96._24_4_;
        auVar92._28_4_ = auVar98._28_4_;
        auVar95 = vmulps_avx512vl(auVar95,ZEXT1632(auVar79));
        auVar86 = ZEXT1632(auVar79);
        auVar97 = vfmadd213ps_avx512vl(auVar99,auVar99,auVar86);
        auVar74 = vfmadd231ps_fma(auVar97,auVar100,auVar100);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
        fVar149 = auVar97._0_4_;
        fVar135 = auVar97._4_4_;
        fVar136 = auVar97._8_4_;
        fVar137 = auVar97._12_4_;
        fVar167 = auVar97._16_4_;
        fVar170 = auVar97._20_4_;
        fVar69 = auVar97._24_4_;
        auVar81._4_4_ = fVar135 * fVar135 * fVar135 * auVar74._4_4_ * -0.5;
        auVar81._0_4_ = fVar149 * fVar149 * fVar149 * auVar74._0_4_ * -0.5;
        auVar81._8_4_ = fVar136 * fVar136 * fVar136 * auVar74._8_4_ * -0.5;
        auVar81._12_4_ = fVar137 * fVar137 * fVar137 * auVar74._12_4_ * -0.5;
        auVar81._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar81._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar81._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
        auVar81._28_4_ = 0;
        auVar80 = vfmadd231ps_avx512vl(auVar81,auVar80,auVar97);
        auVar91._4_4_ = auVar100._4_4_ * auVar80._4_4_;
        auVar91._0_4_ = auVar100._0_4_ * auVar80._0_4_;
        auVar91._8_4_ = auVar100._8_4_ * auVar80._8_4_;
        auVar91._12_4_ = auVar100._12_4_ * auVar80._12_4_;
        auVar91._16_4_ = auVar100._16_4_ * auVar80._16_4_;
        auVar91._20_4_ = auVar100._20_4_ * auVar80._20_4_;
        auVar91._24_4_ = auVar100._24_4_ * auVar80._24_4_;
        auVar91._28_4_ = auVar97._28_4_;
        auVar82._4_4_ = -auVar99._4_4_ * auVar80._4_4_;
        auVar82._0_4_ = -auVar99._0_4_ * auVar80._0_4_;
        auVar82._8_4_ = -auVar99._8_4_ * auVar80._8_4_;
        auVar82._12_4_ = -auVar99._12_4_ * auVar80._12_4_;
        auVar82._16_4_ = -auVar99._16_4_ * auVar80._16_4_;
        auVar82._20_4_ = -auVar99._20_4_ * auVar80._20_4_;
        auVar82._24_4_ = -auVar99._24_4_ * auVar80._24_4_;
        auVar82._28_4_ = auVar99._28_4_ ^ 0x80000000;
        auVar97 = vmulps_avx512vl(auVar80,auVar86);
        auVar74 = vfmadd213ps_fma(auVar93,auVar88,auVar83);
        auVar76 = vfmadd213ps_fma(auVar92,auVar88,auVar84);
        auVar80 = vfmadd213ps_avx512vl(auVar95,auVar88,auVar94);
        auVar81 = vfmadd213ps_avx512vl(auVar91,ZEXT1632(auVar21),ZEXT1632(auVar19));
        auVar77 = vfnmadd213ps_fma(auVar93,auVar88,auVar83);
        auVar83 = ZEXT1632(auVar21);
        auVar16 = vfmadd213ps_fma(auVar82,auVar83,ZEXT1632(auVar20));
        auVar78 = vfnmadd213ps_fma(auVar92,auVar88,auVar84);
        auVar17 = vfmadd213ps_fma(auVar97,auVar83,auVar90);
        auVar93 = vfnmadd231ps_avx512vl(auVar94,auVar88,auVar95);
        auVar25 = vfnmadd213ps_fma(auVar91,auVar83,ZEXT1632(auVar19));
        auVar20 = vfnmadd213ps_fma(auVar82,auVar83,ZEXT1632(auVar20));
        auVar26 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar21),auVar97);
        auVar97 = vsubps_avx512vl(auVar81,ZEXT1632(auVar77));
        auVar95 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar78));
        auVar92 = vsubps_avx512vl(ZEXT1632(auVar17),auVar93);
        auVar91 = vmulps_avx512vl(auVar95,auVar93);
        auVar18 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar78),auVar92);
        auVar83._4_4_ = auVar77._4_4_ * auVar92._4_4_;
        auVar83._0_4_ = auVar77._0_4_ * auVar92._0_4_;
        auVar83._8_4_ = auVar77._8_4_ * auVar92._8_4_;
        auVar83._12_4_ = auVar77._12_4_ * auVar92._12_4_;
        auVar83._16_4_ = auVar92._16_4_ * 0.0;
        auVar83._20_4_ = auVar92._20_4_ * 0.0;
        auVar83._24_4_ = auVar92._24_4_ * 0.0;
        auVar83._28_4_ = auVar92._28_4_;
        auVar92 = vfmsub231ps_avx512vl(auVar83,auVar93,auVar97);
        auVar84._4_4_ = auVar78._4_4_ * auVar97._4_4_;
        auVar84._0_4_ = auVar78._0_4_ * auVar97._0_4_;
        auVar84._8_4_ = auVar78._8_4_ * auVar97._8_4_;
        auVar84._12_4_ = auVar78._12_4_ * auVar97._12_4_;
        auVar84._16_4_ = auVar97._16_4_ * 0.0;
        auVar84._20_4_ = auVar97._20_4_ * 0.0;
        auVar84._24_4_ = auVar97._24_4_ * 0.0;
        auVar84._28_4_ = auVar97._28_4_;
        auVar19 = vfmsub231ps_fma(auVar84,ZEXT1632(auVar77),auVar95);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar86,auVar92);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar86,ZEXT1632(auVar18));
        auVar96 = ZEXT1632(auVar79);
        uVar68 = vcmpps_avx512vl(auVar95,auVar96,2);
        bVar57 = (byte)uVar68;
        fVar69 = (float)((uint)(bVar57 & 1) * auVar74._0_4_ |
                        (uint)!(bool)(bVar57 & 1) * auVar25._0_4_);
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        fVar117 = (float)((uint)bVar10 * auVar74._4_4_ | (uint)!bVar10 * auVar25._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        fVar119 = (float)((uint)bVar10 * auVar74._8_4_ | (uint)!bVar10 * auVar25._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        fVar122 = (float)((uint)bVar10 * auVar74._12_4_ | (uint)!bVar10 * auVar25._12_4_);
        auVar91 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar119,CONCAT44(fVar117,fVar69))));
        fVar70 = (float)((uint)(bVar57 & 1) * auVar76._0_4_ |
                        (uint)!(bool)(bVar57 & 1) * auVar20._0_4_);
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        fVar118 = (float)((uint)bVar10 * auVar76._4_4_ | (uint)!bVar10 * auVar20._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        fVar120 = (float)((uint)bVar10 * auVar76._8_4_ | (uint)!bVar10 * auVar20._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        fVar123 = (float)((uint)bVar10 * auVar76._12_4_ | (uint)!bVar10 * auVar20._12_4_);
        auVar82 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar120,CONCAT44(fVar118,fVar70))));
        auVar94._0_4_ =
             (float)((uint)(bVar57 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar26._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar94._4_4_ = (float)((uint)bVar10 * auVar80._4_4_ | (uint)!bVar10 * auVar26._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar94._8_4_ = (float)((uint)bVar10 * auVar80._8_4_ | (uint)!bVar10 * auVar26._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar94._12_4_ = (float)((uint)bVar10 * auVar80._12_4_ | (uint)!bVar10 * auVar26._12_4_);
        fVar135 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar80._16_4_);
        auVar94._16_4_ = fVar135;
        fVar149 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar80._20_4_);
        auVar94._20_4_ = fVar149;
        fVar136 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar80._24_4_);
        auVar94._24_4_ = fVar136;
        iVar1 = (uint)(byte)(uVar68 >> 7) * auVar80._28_4_;
        auVar94._28_4_ = iVar1;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar81);
        auVar101._0_4_ =
             (uint)(bVar57 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar18._0_4_;
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar101._4_4_ = (uint)bVar10 * auVar97._4_4_ | (uint)!bVar10 * auVar18._4_4_;
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar101._8_4_ = (uint)bVar10 * auVar97._8_4_ | (uint)!bVar10 * auVar18._8_4_;
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar101._12_4_ = (uint)bVar10 * auVar97._12_4_ | (uint)!bVar10 * auVar18._12_4_;
        auVar101._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar97._16_4_;
        auVar101._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar97._20_4_;
        auVar101._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar97._24_4_;
        auVar101._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar16));
        auVar102._0_4_ =
             (float)((uint)(bVar57 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar76._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar10 * auVar97._4_4_ | (uint)!bVar10 * auVar76._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar10 * auVar97._8_4_ | (uint)!bVar10 * auVar76._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar10 * auVar97._12_4_ | (uint)!bVar10 * auVar76._12_4_);
        fVar137 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar97._16_4_);
        auVar102._16_4_ = fVar137;
        fVar167 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar97._20_4_);
        auVar102._20_4_ = fVar167;
        fVar170 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar97._24_4_);
        auVar102._24_4_ = fVar170;
        auVar102._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(auVar93,ZEXT1632(auVar17));
        auVar103._0_4_ =
             (float)((uint)(bVar57 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar80._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar10 * auVar97._4_4_ | (uint)!bVar10 * auVar80._4_4_);
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar10 * auVar97._8_4_ | (uint)!bVar10 * auVar80._8_4_);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar10 * auVar97._12_4_ | (uint)!bVar10 * auVar80._12_4_);
        bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar10 * auVar97._16_4_ | (uint)!bVar10 * auVar80._16_4_);
        bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar10 * auVar97._20_4_ | (uint)!bVar10 * auVar80._20_4_);
        bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar10 * auVar97._24_4_ | (uint)!bVar10 * auVar80._24_4_);
        bVar10 = SUB81(uVar68 >> 7,0);
        auVar103._28_4_ = (uint)bVar10 * auVar97._28_4_ | (uint)!bVar10 * auVar80._28_4_;
        auVar104._0_4_ =
             (uint)(bVar57 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar81._0_4_;
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar104._4_4_ = (uint)bVar10 * (int)auVar77._4_4_ | (uint)!bVar10 * auVar81._4_4_;
        bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar104._8_4_ = (uint)bVar10 * (int)auVar77._8_4_ | (uint)!bVar10 * auVar81._8_4_;
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar104._12_4_ = (uint)bVar10 * (int)auVar77._12_4_ | (uint)!bVar10 * auVar81._12_4_;
        auVar104._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar81._16_4_;
        auVar104._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar81._20_4_;
        auVar104._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar81._24_4_;
        auVar104._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar81._28_4_;
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar105._0_4_ =
             (uint)(bVar57 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar17._0_4_;
        bVar11 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar17._4_4_;
        bVar11 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar17._8_4_;
        bVar11 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar17._12_4_;
        auVar105._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar93._16_4_;
        auVar105._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar93._20_4_;
        auVar105._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar93._24_4_;
        iVar2 = (uint)(byte)(uVar68 >> 7) * auVar93._28_4_;
        auVar105._28_4_ = iVar2;
        auVar83 = vsubps_avx512vl(auVar104,auVar91);
        auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar78._12_4_ |
                                                (uint)!bVar13 * auVar16._12_4_,
                                                CONCAT48((uint)bVar12 * (int)auVar78._8_4_ |
                                                         (uint)!bVar12 * auVar16._8_4_,
                                                         CONCAT44((uint)bVar10 * (int)auVar78._4_4_
                                                                  | (uint)!bVar10 * auVar16._4_4_,
                                                                  (uint)(bVar57 & 1) *
                                                                  (int)auVar78._0_4_ |
                                                                  (uint)!(bool)(bVar57 & 1) *
                                                                  auVar16._0_4_)))),auVar82);
        auVar93 = vsubps_avx(auVar105,auVar94);
        auVar92 = vsubps_avx(auVar91,auVar101);
        auVar80 = vsubps_avx(auVar82,auVar102);
        auVar81 = vsubps_avx(auVar94,auVar103);
        auVar86._4_4_ = auVar93._4_4_ * fVar117;
        auVar86._0_4_ = auVar93._0_4_ * fVar69;
        auVar86._8_4_ = auVar93._8_4_ * fVar119;
        auVar86._12_4_ = auVar93._12_4_ * fVar122;
        auVar86._16_4_ = auVar93._16_4_ * 0.0;
        auVar86._20_4_ = auVar93._20_4_ * 0.0;
        auVar86._24_4_ = auVar93._24_4_ * 0.0;
        auVar86._28_4_ = iVar2;
        auVar74 = vfmsub231ps_fma(auVar86,auVar94,auVar83);
        auVar87._4_4_ = fVar118 * auVar83._4_4_;
        auVar87._0_4_ = fVar70 * auVar83._0_4_;
        auVar87._8_4_ = fVar120 * auVar83._8_4_;
        auVar87._12_4_ = fVar123 * auVar83._12_4_;
        auVar87._16_4_ = auVar83._16_4_ * 0.0;
        auVar87._20_4_ = auVar83._20_4_ * 0.0;
        auVar87._24_4_ = auVar83._24_4_ * 0.0;
        auVar87._28_4_ = auVar95._28_4_;
        auVar76 = vfmsub231ps_fma(auVar87,auVar91,auVar97);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar96,ZEXT1632(auVar74));
        auVar158._0_4_ = auVar97._0_4_ * auVar94._0_4_;
        auVar158._4_4_ = auVar97._4_4_ * auVar94._4_4_;
        auVar158._8_4_ = auVar97._8_4_ * auVar94._8_4_;
        auVar158._12_4_ = auVar97._12_4_ * auVar94._12_4_;
        auVar158._16_4_ = auVar97._16_4_ * fVar135;
        auVar158._20_4_ = auVar97._20_4_ * fVar149;
        auVar158._24_4_ = auVar97._24_4_ * fVar136;
        auVar158._28_4_ = 0;
        auVar74 = vfmsub231ps_fma(auVar158,auVar82,auVar93);
        auVar84 = vfmadd231ps_avx512vl(auVar95,auVar96,ZEXT1632(auVar74));
        auVar95 = vmulps_avx512vl(auVar81,auVar101);
        auVar95 = vfmsub231ps_avx512vl(auVar95,auVar92,auVar103);
        auVar90._4_4_ = auVar80._4_4_ * auVar103._4_4_;
        auVar90._0_4_ = auVar80._0_4_ * auVar103._0_4_;
        auVar90._8_4_ = auVar80._8_4_ * auVar103._8_4_;
        auVar90._12_4_ = auVar80._12_4_ * auVar103._12_4_;
        auVar90._16_4_ = auVar80._16_4_ * auVar103._16_4_;
        auVar90._20_4_ = auVar80._20_4_ * auVar103._20_4_;
        auVar90._24_4_ = auVar80._24_4_ * auVar103._24_4_;
        auVar90._28_4_ = auVar103._28_4_;
        auVar74 = vfmsub231ps_fma(auVar90,auVar102,auVar81);
        auVar159._0_4_ = auVar102._0_4_ * auVar92._0_4_;
        auVar159._4_4_ = auVar102._4_4_ * auVar92._4_4_;
        auVar159._8_4_ = auVar102._8_4_ * auVar92._8_4_;
        auVar159._12_4_ = auVar102._12_4_ * auVar92._12_4_;
        auVar159._16_4_ = fVar137 * auVar92._16_4_;
        auVar159._20_4_ = fVar167 * auVar92._20_4_;
        auVar159._24_4_ = fVar170 * auVar92._24_4_;
        auVar159._28_4_ = 0;
        auVar76 = vfmsub231ps_fma(auVar159,auVar80,auVar101);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar96,auVar95);
        auVar86 = vfmadd231ps_avx512vl(auVar95,auVar96,ZEXT1632(auVar74));
        auVar95 = vmaxps_avx(auVar84,auVar86);
        uVar138 = vcmpps_avx512vl(auVar95,auVar96,2);
        bVar66 = bVar66 & (byte)uVar138;
        auVar193 = ZEXT3264(local_420);
        auVar194 = ZEXT3264(local_3e0);
        auVar191 = ZEXT3264(local_580);
        auVar190 = ZEXT3264(local_5a0);
        auVar198 = ZEXT3264(local_440);
        auVar184 = ZEXT1664(auVar75);
        if (bVar66 == 0) {
          uVar60 = 0;
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar192 = ZEXT3264(auVar95);
          auVar196 = ZEXT3264(local_4c0);
          auVar197 = ZEXT3264(local_4e0);
          auVar199 = ZEXT3264(local_500);
        }
        else {
          auVar87 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
          auVar189 = ZEXT3264(auVar87);
          auVar32._4_4_ = auVar81._4_4_ * auVar97._4_4_;
          auVar32._0_4_ = auVar81._0_4_ * auVar97._0_4_;
          auVar32._8_4_ = auVar81._8_4_ * auVar97._8_4_;
          auVar32._12_4_ = auVar81._12_4_ * auVar97._12_4_;
          auVar32._16_4_ = auVar81._16_4_ * auVar97._16_4_;
          auVar32._20_4_ = auVar81._20_4_ * auVar97._20_4_;
          auVar32._24_4_ = auVar81._24_4_ * auVar97._24_4_;
          auVar32._28_4_ = auVar95._28_4_;
          auVar16 = vfmsub231ps_fma(auVar32,auVar80,auVar93);
          auVar33._4_4_ = auVar93._4_4_ * auVar92._4_4_;
          auVar33._0_4_ = auVar93._0_4_ * auVar92._0_4_;
          auVar33._8_4_ = auVar93._8_4_ * auVar92._8_4_;
          auVar33._12_4_ = auVar93._12_4_ * auVar92._12_4_;
          auVar33._16_4_ = auVar93._16_4_ * auVar92._16_4_;
          auVar33._20_4_ = auVar93._20_4_ * auVar92._20_4_;
          auVar33._24_4_ = auVar93._24_4_ * auVar92._24_4_;
          auVar33._28_4_ = auVar93._28_4_;
          auVar76 = vfmsub231ps_fma(auVar33,auVar83,auVar81);
          auVar34._4_4_ = auVar80._4_4_ * auVar83._4_4_;
          auVar34._0_4_ = auVar80._0_4_ * auVar83._0_4_;
          auVar34._8_4_ = auVar80._8_4_ * auVar83._8_4_;
          auVar34._12_4_ = auVar80._12_4_ * auVar83._12_4_;
          auVar34._16_4_ = auVar80._16_4_ * auVar83._16_4_;
          auVar34._20_4_ = auVar80._20_4_ * auVar83._20_4_;
          auVar34._24_4_ = auVar80._24_4_ * auVar83._24_4_;
          auVar34._28_4_ = auVar80._28_4_;
          auVar17 = vfmsub231ps_fma(auVar34,auVar92,auVar97);
          auVar74 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar17));
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar16),auVar96);
          auVar97 = vrcp14ps_avx512vl(auVar95);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar192 = ZEXT3264(auVar93);
          auVar92 = vfnmadd213ps_avx512vl(auVar97,auVar95,auVar93);
          auVar74 = vfmadd132ps_fma(auVar92,auVar97,auVar97);
          auVar35._4_4_ = auVar17._4_4_ * auVar94._4_4_;
          auVar35._0_4_ = auVar17._0_4_ * auVar94._0_4_;
          auVar35._8_4_ = auVar17._8_4_ * auVar94._8_4_;
          auVar35._12_4_ = auVar17._12_4_ * auVar94._12_4_;
          auVar35._16_4_ = fVar135 * 0.0;
          auVar35._20_4_ = fVar149 * 0.0;
          auVar35._24_4_ = fVar136 * 0.0;
          auVar35._28_4_ = iVar1;
          auVar76 = vfmadd231ps_fma(auVar35,auVar82,ZEXT1632(auVar76));
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar91,ZEXT1632(auVar16));
          fVar149 = auVar74._0_4_;
          fVar135 = auVar74._4_4_;
          fVar136 = auVar74._8_4_;
          fVar137 = auVar74._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar137,
                                         CONCAT48(auVar76._8_4_ * fVar136,
                                                  CONCAT44(auVar76._4_4_ * fVar135,
                                                           auVar76._0_4_ * fVar149))));
          auVar173._4_4_ = uVar63;
          auVar173._0_4_ = uVar63;
          auVar173._8_4_ = uVar63;
          auVar173._12_4_ = uVar63;
          auVar173._16_4_ = uVar63;
          auVar173._20_4_ = uVar63;
          auVar173._24_4_ = uVar63;
          auVar173._28_4_ = uVar63;
          uVar138 = vcmpps_avx512vl(local_240,auVar87,2);
          uVar22 = vcmpps_avx512vl(auVar173,local_240,2);
          bVar66 = (byte)uVar138 & (byte)uVar22 & bVar66;
          auVar196 = ZEXT3264(local_4c0);
          auVar197 = ZEXT3264(local_4e0);
          auVar199 = ZEXT3264(local_500);
          auVar188 = ZEXT3264(auVar85);
          if (bVar66 != 0) {
            uVar138 = vcmpps_avx512vl(auVar95,auVar96,4);
            bVar66 = bVar66 & (byte)uVar138;
            if (bVar66 != 0) {
              fVar167 = auVar84._0_4_ * fVar149;
              fVar170 = auVar84._4_4_ * fVar135;
              auVar36._4_4_ = fVar170;
              auVar36._0_4_ = fVar167;
              fVar69 = auVar84._8_4_ * fVar136;
              auVar36._8_4_ = fVar69;
              fVar70 = auVar84._12_4_ * fVar137;
              auVar36._12_4_ = fVar70;
              fVar117 = auVar84._16_4_ * 0.0;
              auVar36._16_4_ = fVar117;
              fVar118 = auVar84._20_4_ * 0.0;
              auVar36._20_4_ = fVar118;
              fVar119 = auVar84._24_4_ * 0.0;
              auVar36._24_4_ = fVar119;
              auVar36._28_4_ = auVar95._28_4_;
              auVar97 = vsubps_avx512vl(auVar93,auVar36);
              local_280._0_4_ =
                   (float)((uint)(bVar57 & 1) * (int)fVar167 |
                          (uint)!(bool)(bVar57 & 1) * auVar97._0_4_);
              bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
              local_280._4_4_ = (float)((uint)bVar10 * (int)fVar170 | (uint)!bVar10 * auVar97._4_4_)
              ;
              bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
              local_280._8_4_ = (float)((uint)bVar10 * (int)fVar69 | (uint)!bVar10 * auVar97._8_4_);
              bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
              local_280._12_4_ =
                   (float)((uint)bVar10 * (int)fVar70 | (uint)!bVar10 * auVar97._12_4_);
              bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
              local_280._16_4_ =
                   (float)((uint)bVar10 * (int)fVar117 | (uint)!bVar10 * auVar97._16_4_);
              bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
              local_280._20_4_ =
                   (float)((uint)bVar10 * (int)fVar118 | (uint)!bVar10 * auVar97._20_4_);
              bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
              local_280._24_4_ =
                   (float)((uint)bVar10 * (int)fVar119 | (uint)!bVar10 * auVar97._24_4_);
              bVar10 = SUB81(uVar68 >> 7,0);
              local_280._28_4_ =
                   (float)((uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar97._28_4_);
              auVar95 = vsubps_avx(ZEXT1632(auVar21),auVar88);
              auVar74 = vfmadd213ps_fma(auVar95,local_280,auVar88);
              uVar126 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
              auVar88._4_4_ = uVar126;
              auVar88._0_4_ = uVar126;
              auVar88._8_4_ = uVar126;
              auVar88._12_4_ = uVar126;
              auVar88._16_4_ = uVar126;
              auVar88._20_4_ = uVar126;
              auVar88._24_4_ = uVar126;
              auVar88._28_4_ = uVar126;
              auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                                           CONCAT48(auVar74._8_4_ + auVar74._8_4_,
                                                                    CONCAT44(auVar74._4_4_ +
                                                                             auVar74._4_4_,
                                                                             auVar74._0_4_ +
                                                                             auVar74._0_4_)))),
                                        auVar88);
              uVar138 = vcmpps_avx512vl(local_240,auVar95,6);
              if (((byte)uVar138 & bVar66) != 0) {
                auVar154._0_4_ = auVar86._0_4_ * fVar149;
                auVar154._4_4_ = auVar86._4_4_ * fVar135;
                auVar154._8_4_ = auVar86._8_4_ * fVar136;
                auVar154._12_4_ = auVar86._12_4_ * fVar137;
                auVar154._16_4_ = auVar86._16_4_ * 0.0;
                auVar154._20_4_ = auVar86._20_4_ * 0.0;
                auVar154._24_4_ = auVar86._24_4_ * 0.0;
                auVar154._28_4_ = 0;
                auVar95 = vsubps_avx512vl(auVar93,auVar154);
                auVar106._0_4_ =
                     (uint)(bVar57 & 1) * (int)auVar154._0_4_ |
                     (uint)!(bool)(bVar57 & 1) * auVar95._0_4_;
                bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
                auVar106._4_4_ = (uint)bVar10 * (int)auVar154._4_4_ | (uint)!bVar10 * auVar95._4_4_;
                bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                auVar106._8_4_ = (uint)bVar10 * (int)auVar154._8_4_ | (uint)!bVar10 * auVar95._8_4_;
                bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
                auVar106._12_4_ =
                     (uint)bVar10 * (int)auVar154._12_4_ | (uint)!bVar10 * auVar95._12_4_;
                bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
                auVar106._16_4_ =
                     (uint)bVar10 * (int)auVar154._16_4_ | (uint)!bVar10 * auVar95._16_4_;
                bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
                auVar106._20_4_ =
                     (uint)bVar10 * (int)auVar154._20_4_ | (uint)!bVar10 * auVar95._20_4_;
                bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
                auVar106._24_4_ =
                     (uint)bVar10 * (int)auVar154._24_4_ | (uint)!bVar10 * auVar95._24_4_;
                auVar106._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar95._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_260 = vfmsub132ps_avx512vl(auVar106,auVar93,auVar29);
                local_220 = 0;
                local_210 = local_510._0_8_;
                uStack_208 = local_510._8_8_;
                local_200 = local_520._0_8_;
                uStack_1f8 = local_520._8_8_;
                local_1f0 = local_530._0_8_;
                uStack_1e8 = local_530._8_8_;
                if ((pGVar62->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar60 = CONCAT71((int7)(uVar60 >> 8),1),
                     pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar149 = 1.0 / auVar89._0_4_;
                    local_1c0[0] = fVar149 * (local_280._0_4_ + 0.0);
                    local_1c0[1] = fVar149 * (local_280._4_4_ + 1.0);
                    local_1c0[2] = fVar149 * (local_280._8_4_ + 2.0);
                    local_1c0[3] = fVar149 * (local_280._12_4_ + 3.0);
                    fStack_1b0 = fVar149 * (local_280._16_4_ + 4.0);
                    fStack_1ac = fVar149 * (local_280._20_4_ + 5.0);
                    fStack_1a8 = fVar149 * (local_280._24_4_ + 6.0);
                    fStack_1a4 = local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    uVar68 = 0;
                    uVar61 = (ulong)((byte)uVar138 & bVar66);
                    for (uVar67 = uVar61; (uVar67 & 1) == 0;
                        uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                      uVar68 = uVar68 + 1;
                    }
                    _local_2c0 = vpbroadcastd_avx512vl();
                    local_4a0 = vpbroadcastd_avx512vl();
                    local_5f0 = auVar75;
                    local_460 = auVar85;
                    local_400 = auVar87;
                    local_21c = iVar7;
                    do {
                      auVar76 = auVar195._0_16_;
                      local_320 = local_1c0[uVar68];
                      local_310 = *(undefined4 *)(local_1a0 + uVar68 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar68 * 4);
                      local_5d0.context = context->user;
                      fVar135 = 1.0 - local_320;
                      fVar149 = fVar135 * fVar135 * -3.0;
                      auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                                ZEXT416((uint)(local_320 * fVar135)),
                                                ZEXT416(0xc0000000));
                      auVar74 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar135)),
                                                ZEXT416((uint)(local_320 * local_320)),
                                                ZEXT416(0x40000000));
                      fVar135 = auVar75._0_4_ * 3.0;
                      fVar136 = auVar74._0_4_ * 3.0;
                      fVar137 = local_320 * local_320 * 3.0;
                      auVar165._0_4_ = fVar137 * (float)local_3b0._0_4_;
                      auVar165._4_4_ = fVar137 * (float)local_3b0._4_4_;
                      auVar165._8_4_ = fVar137 * fStack_3a8;
                      auVar165._12_4_ = fVar137 * fStack_3a4;
                      auVar131._4_4_ = fVar136;
                      auVar131._0_4_ = fVar136;
                      auVar131._8_4_ = fVar136;
                      auVar131._12_4_ = fVar136;
                      auVar75 = vfmadd132ps_fma(auVar131,auVar165,local_530);
                      auVar152._4_4_ = fVar135;
                      auVar152._0_4_ = fVar135;
                      auVar152._8_4_ = fVar135;
                      auVar152._12_4_ = fVar135;
                      auVar75 = vfmadd132ps_fma(auVar152,auVar75,local_520);
                      auVar132._4_4_ = fVar149;
                      auVar132._0_4_ = fVar149;
                      auVar132._8_4_ = fVar149;
                      auVar132._12_4_ = fVar149;
                      auVar75 = vfmadd132ps_fma(auVar132,auVar75,local_510);
                      local_350 = auVar75._0_4_;
                      local_340 = vshufps_avx(auVar75,auVar75,0x55);
                      local_330 = vshufps_avx(auVar75,auVar75,0xaa);
                      local_300 = local_4a0._0_8_;
                      uStack_2f8 = local_4a0._8_8_;
                      local_2f0 = _local_2c0;
                      vpcmpeqd_avx2(ZEXT1632(_local_2c0),ZEXT1632(_local_2c0));
                      uStack_2dc = (local_5d0.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_5d0.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_610 = local_3c0;
                      local_5d0.valid = (int *)local_610;
                      local_5d0.geometryUserPtr = pGVar62->userPtr;
                      local_5d0.hit = (RTCHitN *)&local_350;
                      local_5d0.N = 4;
                      local_380 = (float)uVar61;
                      fStack_37c = (float)(uVar61 >> 0x20);
                      local_3a0 = (uint)uVar68;
                      uStack_39c = (uint)(uVar68 >> 0x20);
                      local_5d0.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      fStack_31c = local_320;
                      fStack_318 = local_320;
                      fStack_314 = local_320;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar62->occlusionFilterN)(&local_5d0);
                        uVar68 = CONCAT44(uStack_39c,local_3a0);
                        uVar61 = CONCAT44(fStack_37c,local_380);
                        auVar189 = ZEXT3264(local_400);
                        auVar184 = ZEXT1664(local_5f0);
                        auVar188 = ZEXT3264(local_460);
                        auVar199 = ZEXT3264(local_500);
                        auVar197 = ZEXT3264(local_4e0);
                        auVar198 = ZEXT3264(local_440);
                        auVar196 = ZEXT3264(local_4c0);
                        auVar190 = ZEXT3264(local_5a0);
                        auVar191 = ZEXT3264(local_580);
                        auVar194 = ZEXT3264(local_3e0);
                        auVar193 = ZEXT3264(local_420);
                        auVar75 = vxorps_avx512vl(auVar76,auVar76);
                        auVar195 = ZEXT1664(auVar75);
                        uVar63 = local_480._0_4_;
                      }
                      auVar75 = auVar195._0_16_;
                      uVar67 = vptestmd_avx512vl(local_610,local_610);
                      if ((uVar67 & 0xf) == 0) {
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar192 = ZEXT3264(auVar95);
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if (p_Var9 == (RTCFilterFunctionN)0x0) {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar95);
                        }
                        else {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar95);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar62->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var9)(&local_5d0);
                            uVar68 = CONCAT44(uStack_39c,local_3a0);
                            uVar61 = CONCAT44(fStack_37c,local_380);
                            auVar189 = ZEXT3264(local_400);
                            auVar184 = ZEXT1664(local_5f0);
                            auVar188 = ZEXT3264(local_460);
                            auVar199 = ZEXT3264(local_500);
                            auVar197 = ZEXT3264(local_4e0);
                            auVar198 = ZEXT3264(local_440);
                            auVar196 = ZEXT3264(local_4c0);
                            auVar190 = ZEXT3264(local_5a0);
                            auVar191 = ZEXT3264(local_580);
                            auVar194 = ZEXT3264(local_3e0);
                            auVar193 = ZEXT3264(local_420);
                            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar192 = ZEXT3264(auVar95);
                            auVar75 = vxorps_avx512vl(auVar75,auVar75);
                            auVar195 = ZEXT1664(auVar75);
                            uVar63 = local_480._0_4_;
                          }
                        }
                        local_380 = auVar184._0_4_;
                        auVar85 = auVar188._0_32_;
                        uVar67 = vptestmd_avx512vl(local_610,local_610);
                        uVar67 = uVar67 & 0xf;
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar67 & 1);
                        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar13 = SUB81(uVar67 >> 3,0);
                        *(uint *)(local_5d0.ray + 0x80) =
                             (uint)bVar10 * auVar75._0_4_ |
                             (uint)!bVar10 * *(int *)(local_5d0.ray + 0x80);
                        *(uint *)(local_5d0.ray + 0x84) =
                             (uint)bVar11 * auVar75._4_4_ |
                             (uint)!bVar11 * *(int *)(local_5d0.ray + 0x84);
                        *(uint *)(local_5d0.ray + 0x88) =
                             (uint)bVar12 * auVar75._8_4_ |
                             (uint)!bVar12 * *(int *)(local_5d0.ray + 0x88);
                        *(uint *)(local_5d0.ray + 0x8c) =
                             (uint)bVar13 * auVar75._12_4_ |
                             (uint)!bVar13 * *(int *)(local_5d0.ray + 0x8c);
                        if ((byte)uVar67 != 0) {
                          uVar60 = CONCAT71((int7)(uVar60 >> 8),1);
                          break;
                        }
                      }
                      local_380 = auVar184._0_4_;
                      auVar85 = auVar188._0_32_;
                      *(int *)(ray + k * 4 + 0x80) = auVar189._0_4_;
                      uVar67 = uVar68 & 0x3f;
                      uVar60 = 0;
                      uVar68 = 0;
                      uVar61 = uVar61 ^ 1L << uVar67;
                      for (uVar67 = uVar61; (uVar67 & 1) == 0;
                          uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        uVar68 = uVar68 + 1;
                      }
                    } while (uVar61 != 0);
                  }
                  goto LAB_01b7e124;
                }
              }
            }
          }
          uVar60 = 0;
        }
      }
LAB_01b7e124:
      if (8 < iVar7) {
        local_480 = vpbroadcastd_avx512vl();
        fStack_2b0 = 1.0 / (float)local_550._0_4_;
        local_2c0._4_4_ = fStack_2b0;
        local_2c0._0_4_ = fStack_2b0;
        fStack_2b8 = fStack_2b0;
        fStack_2b4 = fStack_2b0;
        local_550 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar64 = 8;
        local_460 = auVar85;
        local_3a0 = uVar63;
        uStack_39c = uVar63;
        uStack_398 = uVar63;
        uStack_394 = uVar63;
        uStack_390 = uVar63;
        uStack_38c = uVar63;
        uStack_388 = uVar63;
        uStack_384 = uVar63;
        fStack_37c = local_380;
        fStack_378 = local_380;
        fStack_374 = local_380;
        fStack_370 = local_380;
        fStack_36c = local_380;
        fStack_368 = local_380;
        fStack_364 = local_380;
        fStack_2ac = fStack_2b0;
        fStack_2a8 = fStack_2b0;
        fStack_2a4 = fStack_2b0;
        do {
          auVar95 = vpbroadcastd_avx512vl();
          auVar80 = vpor_avx2(auVar95,_DAT_01fe9900);
          uVar22 = vpcmpd_avx512vl(auVar80,local_480,1);
          auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 * 4 + lVar23);
          auVar97 = *(undefined1 (*) [32])(lVar23 + 0x21aa768 + lVar64 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar23 + 0x21aabec + lVar64 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar23 + 0x21ab070 + lVar64 * 4);
          local_4e0 = auVar197._0_32_;
          auVar81 = vmulps_avx512vl(local_4e0,auVar92);
          local_500 = auVar199._0_32_;
          auVar91 = vmulps_avx512vl(local_500,auVar92);
          auVar37._4_4_ = auVar92._4_4_ * (float)local_e0._4_4_;
          auVar37._0_4_ = auVar92._0_4_ * (float)local_e0._0_4_;
          auVar37._8_4_ = auVar92._8_4_ * fStack_d8;
          auVar37._12_4_ = auVar92._12_4_ * fStack_d4;
          auVar37._16_4_ = auVar92._16_4_ * fStack_d0;
          auVar37._20_4_ = auVar92._20_4_ * fStack_cc;
          auVar37._24_4_ = auVar92._24_4_ * fStack_c8;
          auVar37._28_4_ = auVar80._28_4_;
          local_4c0 = auVar196._0_32_;
          auVar80 = vfmadd231ps_avx512vl(auVar81,auVar93,local_4c0);
          auVar100 = auVar198._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar100);
          auVar91 = vfmadd231ps_avx512vl(auVar37,auVar93,local_c0);
          auVar98 = auVar191._0_32_;
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,auVar98);
          auVar96 = auVar190._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar97,auVar96);
          auVar75 = vfmadd231ps_fma(auVar91,auVar97,local_a0);
          auVar99 = auVar193._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar80,auVar95,auVar99);
          local_3e0 = auVar194._0_32_;
          auVar86 = vfmadd231ps_avx512vl(auVar81,auVar95,local_3e0);
          auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 * 4 + lVar23);
          auVar81 = *(undefined1 (*) [32])(lVar23 + 0x21acb88 + lVar64 * 4);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar95,local_80);
          auVar91 = *(undefined1 (*) [32])(lVar23 + 0x21ad00c + lVar64 * 4);
          auVar82 = *(undefined1 (*) [32])(lVar23 + 0x21ad490 + lVar64 * 4);
          auVar85 = vmulps_avx512vl(local_4e0,auVar82);
          auVar83 = vmulps_avx512vl(local_500,auVar82);
          auVar38._4_4_ = auVar82._4_4_ * (float)local_e0._4_4_;
          auVar38._0_4_ = auVar82._0_4_ * (float)local_e0._0_4_;
          auVar38._8_4_ = auVar82._8_4_ * fStack_d8;
          auVar38._12_4_ = auVar82._12_4_ * fStack_d4;
          auVar38._16_4_ = auVar82._16_4_ * fStack_d0;
          auVar38._20_4_ = auVar82._20_4_ * fStack_cc;
          auVar38._24_4_ = auVar82._24_4_ * fStack_c8;
          auVar38._28_4_ = uStack_c4;
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,local_4c0);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar91,auVar100);
          auVar87 = vfmadd231ps_avx512vl(auVar38,auVar91,local_c0);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,auVar98);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar81,auVar96);
          auVar74 = vfmadd231ps_fma(auVar87,auVar81,local_a0);
          auVar87 = vfmadd231ps_avx512vl(auVar85,auVar80,auVar99);
          auVar88 = vfmadd231ps_avx512vl(auVar83,auVar80,local_3e0);
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar80,local_80);
          auVar89 = vmaxps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar74));
          auVar85 = vsubps_avx(auVar87,auVar84);
          auVar83 = vsubps_avx(auVar88,auVar86);
          auVar90 = vmulps_avx512vl(auVar86,auVar85);
          auVar94 = vmulps_avx512vl(auVar84,auVar83);
          auVar90 = vsubps_avx512vl(auVar90,auVar94);
          auVar94 = vmulps_avx512vl(auVar83,auVar83);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar85,auVar85);
          auVar89 = vmulps_avx512vl(auVar89,auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar94);
          auVar90 = vmulps_avx512vl(auVar90,auVar90);
          uVar138 = vcmpps_avx512vl(auVar90,auVar89,2);
          bVar66 = (byte)uVar22 & (byte)uVar138;
          if (bVar66 == 0) {
            auVar191 = ZEXT3264(auVar98);
            auVar184 = ZEXT3264(auVar96);
          }
          else {
            auVar82 = vmulps_avx512vl(local_460,auVar82);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar82);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_120,auVar91);
            auVar80 = vfmadd213ps_avx512vl(auVar80,local_100,auVar81);
            auVar92 = vmulps_avx512vl(local_460,auVar92);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar93);
            auVar81 = vfmadd213ps_avx512vl(auVar95,local_100,auVar97);
            auVar95 = *(undefined1 (*) [32])(lVar23 + 0x21ab4f4 + lVar64 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar23 + 0x21ab978 + lVar64 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar23 + 0x21abdfc + lVar64 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar23 + 0x21ac280 + lVar64 * 4);
            auVar91 = vmulps_avx512vl(local_4e0,auVar92);
            auVar82 = vmulps_avx512vl(local_500,auVar92);
            auVar92 = vmulps_avx512vl(local_460,auVar92);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,local_4c0);
            auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,auVar100);
            auVar93 = vfmadd231ps_avx512vl(auVar92,local_140,auVar93);
            auVar92 = vfmadd231ps_avx512vl(auVar91,auVar97,auVar98);
            auVar91 = vfmadd231ps_avx512vl(auVar82,auVar97,auVar96);
            auVar97 = vfmadd231ps_avx512vl(auVar93,local_120,auVar97);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar99);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar95,local_3e0);
            auVar82 = vfmadd231ps_avx512vl(auVar97,local_100,auVar95);
            auVar95 = *(undefined1 (*) [32])(lVar23 + 0x21ad914 + lVar64 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar23 + 0x21ae21c + lVar64 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar23 + 0x21ae6a0 + lVar64 * 4);
            auVar89 = vmulps_avx512vl(local_4e0,auVar93);
            auVar90 = vmulps_avx512vl(local_500,auVar93);
            auVar93 = vmulps_avx512vl(local_460,auVar93);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,local_4c0);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar100);
            auVar93 = vfmadd231ps_avx512vl(auVar93,local_140,auVar97);
            auVar97 = *(undefined1 (*) [32])(lVar23 + 0x21add98 + lVar64 * 4);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar98);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar96);
            auVar97 = vfmadd231ps_avx512vl(auVar93,local_120,auVar97);
            auVar93 = vfmadd231ps_avx512vl(auVar89,auVar95,auVar99);
            auVar89 = vfmadd231ps_avx512vl(auVar90,auVar95,local_3e0);
            auVar97 = vfmadd231ps_avx512vl(auVar97,local_100,auVar95);
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar92,auVar90);
            vandps_avx512vl(auVar91,auVar90);
            auVar95 = vmaxps_avx(auVar90,auVar90);
            vandps_avx512vl(auVar82,auVar90);
            auVar95 = vmaxps_avx(auVar95,auVar90);
            auVar56._4_4_ = fStack_37c;
            auVar56._0_4_ = local_380;
            auVar56._8_4_ = fStack_378;
            auVar56._12_4_ = fStack_374;
            auVar56._16_4_ = fStack_370;
            auVar56._20_4_ = fStack_36c;
            auVar56._24_4_ = fStack_368;
            auVar56._28_4_ = fStack_364;
            uVar68 = vcmpps_avx512vl(auVar95,auVar56,1);
            bVar10 = (bool)((byte)uVar68 & 1);
            auVar107._0_4_ = (float)((uint)bVar10 * auVar85._0_4_ | (uint)!bVar10 * auVar92._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar10 * auVar85._4_4_ | (uint)!bVar10 * auVar92._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar10 * auVar85._8_4_ | (uint)!bVar10 * auVar92._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar10 * auVar85._12_4_ | (uint)!bVar10 * auVar92._12_4_);
            bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar107._16_4_ =
                 (float)((uint)bVar10 * auVar85._16_4_ | (uint)!bVar10 * auVar92._16_4_);
            bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar107._20_4_ =
                 (float)((uint)bVar10 * auVar85._20_4_ | (uint)!bVar10 * auVar92._20_4_);
            bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar107._24_4_ =
                 (float)((uint)bVar10 * auVar85._24_4_ | (uint)!bVar10 * auVar92._24_4_);
            bVar10 = SUB81(uVar68 >> 7,0);
            auVar107._28_4_ = (uint)bVar10 * auVar85._28_4_ | (uint)!bVar10 * auVar92._28_4_;
            bVar10 = (bool)((byte)uVar68 & 1);
            auVar108._0_4_ = (float)((uint)bVar10 * auVar83._0_4_ | (uint)!bVar10 * auVar91._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar91._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar91._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar91._12_4_);
            bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar108._16_4_ =
                 (float)((uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * auVar91._16_4_);
            bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar108._20_4_ =
                 (float)((uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * auVar91._20_4_);
            bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar108._24_4_ =
                 (float)((uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * auVar91._24_4_);
            bVar10 = SUB81(uVar68 >> 7,0);
            auVar108._28_4_ = (uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * auVar91._28_4_;
            vandps_avx512vl(auVar93,auVar90);
            vandps_avx512vl(auVar89,auVar90);
            auVar95 = vmaxps_avx(auVar108,auVar108);
            vandps_avx512vl(auVar97,auVar90);
            auVar95 = vmaxps_avx(auVar95,auVar108);
            uVar68 = vcmpps_avx512vl(auVar95,auVar56,1);
            bVar10 = (bool)((byte)uVar68 & 1);
            auVar109._0_4_ = (uint)bVar10 * auVar85._0_4_ | (uint)!bVar10 * auVar93._0_4_;
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar109._4_4_ = (uint)bVar10 * auVar85._4_4_ | (uint)!bVar10 * auVar93._4_4_;
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar109._8_4_ = (uint)bVar10 * auVar85._8_4_ | (uint)!bVar10 * auVar93._8_4_;
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar109._12_4_ = (uint)bVar10 * auVar85._12_4_ | (uint)!bVar10 * auVar93._12_4_;
            bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar109._16_4_ = (uint)bVar10 * auVar85._16_4_ | (uint)!bVar10 * auVar93._16_4_;
            bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar109._20_4_ = (uint)bVar10 * auVar85._20_4_ | (uint)!bVar10 * auVar93._20_4_;
            bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar109._24_4_ = (uint)bVar10 * auVar85._24_4_ | (uint)!bVar10 * auVar93._24_4_;
            bVar10 = SUB81(uVar68 >> 7,0);
            auVar109._28_4_ = (uint)bVar10 * auVar85._28_4_ | (uint)!bVar10 * auVar93._28_4_;
            bVar10 = (bool)((byte)uVar68 & 1);
            auVar110._0_4_ = (float)((uint)bVar10 * auVar83._0_4_ | (uint)!bVar10 * auVar89._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar89._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar89._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar89._12_4_);
            bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * auVar89._16_4_);
            bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * auVar89._20_4_);
            bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * auVar89._24_4_);
            bVar10 = SUB81(uVar68 >> 7,0);
            auVar110._28_4_ = (uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * auVar89._28_4_;
            auVar177._8_4_ = 0x80000000;
            auVar177._0_8_ = 0x8000000080000000;
            auVar177._12_4_ = 0x80000000;
            auVar177._16_4_ = 0x80000000;
            auVar177._20_4_ = 0x80000000;
            auVar177._24_4_ = 0x80000000;
            auVar177._28_4_ = 0x80000000;
            auVar95 = vxorps_avx512vl(auVar109,auVar177);
            auVar89 = auVar195._0_32_;
            auVar97 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar89);
            auVar76 = vfmadd231ps_fma(auVar97,auVar108,auVar108);
            auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
            auVar187._8_4_ = 0xbf000000;
            auVar187._0_8_ = 0xbf000000bf000000;
            auVar187._12_4_ = 0xbf000000;
            auVar187._16_4_ = 0xbf000000;
            auVar187._20_4_ = 0xbf000000;
            auVar187._24_4_ = 0xbf000000;
            auVar187._28_4_ = 0xbf000000;
            fVar149 = auVar97._0_4_;
            fVar135 = auVar97._4_4_;
            fVar136 = auVar97._8_4_;
            fVar137 = auVar97._12_4_;
            fVar167 = auVar97._16_4_;
            fVar170 = auVar97._20_4_;
            fVar69 = auVar97._24_4_;
            auVar39._4_4_ = fVar135 * fVar135 * fVar135 * auVar76._4_4_ * -0.5;
            auVar39._0_4_ = fVar149 * fVar149 * fVar149 * auVar76._0_4_ * -0.5;
            auVar39._8_4_ = fVar136 * fVar136 * fVar136 * auVar76._8_4_ * -0.5;
            auVar39._12_4_ = fVar137 * fVar137 * fVar137 * auVar76._12_4_ * -0.5;
            auVar39._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
            auVar39._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar39._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
            auVar39._28_4_ = auVar108._28_4_;
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar97 = vfmadd231ps_avx512vl(auVar39,auVar93,auVar97);
            auVar40._4_4_ = auVar108._4_4_ * auVar97._4_4_;
            auVar40._0_4_ = auVar108._0_4_ * auVar97._0_4_;
            auVar40._8_4_ = auVar108._8_4_ * auVar97._8_4_;
            auVar40._12_4_ = auVar108._12_4_ * auVar97._12_4_;
            auVar40._16_4_ = auVar108._16_4_ * auVar97._16_4_;
            auVar40._20_4_ = auVar108._20_4_ * auVar97._20_4_;
            auVar40._24_4_ = auVar108._24_4_ * auVar97._24_4_;
            auVar40._28_4_ = 0;
            auVar41._4_4_ = auVar97._4_4_ * -auVar107._4_4_;
            auVar41._0_4_ = auVar97._0_4_ * -auVar107._0_4_;
            auVar41._8_4_ = auVar97._8_4_ * -auVar107._8_4_;
            auVar41._12_4_ = auVar97._12_4_ * -auVar107._12_4_;
            auVar41._16_4_ = auVar97._16_4_ * -auVar107._16_4_;
            auVar41._20_4_ = auVar97._20_4_ * -auVar107._20_4_;
            auVar41._24_4_ = auVar97._24_4_ * -auVar107._24_4_;
            auVar41._28_4_ = auVar108._28_4_;
            auVar92 = vmulps_avx512vl(auVar97,auVar89);
            auVar97 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar89);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar110);
            auVar91 = vrsqrt14ps_avx512vl(auVar97);
            auVar97 = vmulps_avx512vl(auVar97,auVar187);
            fVar149 = auVar91._0_4_;
            fVar135 = auVar91._4_4_;
            fVar136 = auVar91._8_4_;
            fVar137 = auVar91._12_4_;
            fVar167 = auVar91._16_4_;
            fVar170 = auVar91._20_4_;
            fVar69 = auVar91._24_4_;
            auVar42._4_4_ = fVar135 * fVar135 * fVar135 * auVar97._4_4_;
            auVar42._0_4_ = fVar149 * fVar149 * fVar149 * auVar97._0_4_;
            auVar42._8_4_ = fVar136 * fVar136 * fVar136 * auVar97._8_4_;
            auVar42._12_4_ = fVar137 * fVar137 * fVar137 * auVar97._12_4_;
            auVar42._16_4_ = fVar167 * fVar167 * fVar167 * auVar97._16_4_;
            auVar42._20_4_ = fVar170 * fVar170 * fVar170 * auVar97._20_4_;
            auVar42._24_4_ = fVar69 * fVar69 * fVar69 * auVar97._24_4_;
            auVar42._28_4_ = auVar97._28_4_;
            auVar97 = vfmadd231ps_avx512vl(auVar42,auVar93,auVar91);
            auVar43._4_4_ = auVar110._4_4_ * auVar97._4_4_;
            auVar43._0_4_ = auVar110._0_4_ * auVar97._0_4_;
            auVar43._8_4_ = auVar110._8_4_ * auVar97._8_4_;
            auVar43._12_4_ = auVar110._12_4_ * auVar97._12_4_;
            auVar43._16_4_ = auVar110._16_4_ * auVar97._16_4_;
            auVar43._20_4_ = auVar110._20_4_ * auVar97._20_4_;
            auVar43._24_4_ = auVar110._24_4_ * auVar97._24_4_;
            auVar43._28_4_ = auVar91._28_4_;
            auVar44._4_4_ = auVar97._4_4_ * auVar95._4_4_;
            auVar44._0_4_ = auVar97._0_4_ * auVar95._0_4_;
            auVar44._8_4_ = auVar97._8_4_ * auVar95._8_4_;
            auVar44._12_4_ = auVar97._12_4_ * auVar95._12_4_;
            auVar44._16_4_ = auVar97._16_4_ * auVar95._16_4_;
            auVar44._20_4_ = auVar97._20_4_ * auVar95._20_4_;
            auVar44._24_4_ = auVar97._24_4_ * auVar95._24_4_;
            auVar44._28_4_ = auVar95._28_4_;
            auVar95 = vmulps_avx512vl(auVar97,auVar89);
            auVar76 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar75),auVar84);
            auVar97 = ZEXT1632(auVar75);
            auVar16 = vfmadd213ps_fma(auVar41,auVar97,auVar86);
            auVar93 = vfmadd213ps_avx512vl(auVar92,auVar97,auVar81);
            auVar91 = vfmadd213ps_avx512vl(auVar43,ZEXT1632(auVar74),auVar87);
            auVar21 = vfnmadd213ps_fma(auVar40,auVar97,auVar84);
            auVar82 = ZEXT1632(auVar74);
            auVar17 = vfmadd213ps_fma(auVar44,auVar82,auVar88);
            auVar77 = vfnmadd213ps_fma(auVar41,auVar97,auVar86);
            auVar18 = vfmadd213ps_fma(auVar95,auVar82,auVar80);
            auVar86 = ZEXT1632(auVar75);
            auVar26 = vfnmadd231ps_fma(auVar81,auVar86,auVar92);
            auVar78 = vfnmadd213ps_fma(auVar43,auVar82,auVar87);
            auVar25 = vfnmadd213ps_fma(auVar44,auVar82,auVar88);
            auVar79 = vfnmadd231ps_fma(auVar80,ZEXT1632(auVar74),auVar95);
            auVar80 = vsubps_avx512vl(auVar91,ZEXT1632(auVar21));
            auVar95 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar77));
            auVar97 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar26));
            auVar45._4_4_ = auVar95._4_4_ * auVar26._4_4_;
            auVar45._0_4_ = auVar95._0_4_ * auVar26._0_4_;
            auVar45._8_4_ = auVar95._8_4_ * auVar26._8_4_;
            auVar45._12_4_ = auVar95._12_4_ * auVar26._12_4_;
            auVar45._16_4_ = auVar95._16_4_ * 0.0;
            auVar45._20_4_ = auVar95._20_4_ * 0.0;
            auVar45._24_4_ = auVar95._24_4_ * 0.0;
            auVar45._28_4_ = auVar92._28_4_;
            auVar75 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar77),auVar97);
            auVar46._4_4_ = auVar97._4_4_ * auVar21._4_4_;
            auVar46._0_4_ = auVar97._0_4_ * auVar21._0_4_;
            auVar46._8_4_ = auVar97._8_4_ * auVar21._8_4_;
            auVar46._12_4_ = auVar97._12_4_ * auVar21._12_4_;
            auVar46._16_4_ = auVar97._16_4_ * 0.0;
            auVar46._20_4_ = auVar97._20_4_ * 0.0;
            auVar46._24_4_ = auVar97._24_4_ * 0.0;
            auVar46._28_4_ = auVar97._28_4_;
            auVar19 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar26),auVar80);
            auVar47._4_4_ = auVar77._4_4_ * auVar80._4_4_;
            auVar47._0_4_ = auVar77._0_4_ * auVar80._0_4_;
            auVar47._8_4_ = auVar77._8_4_ * auVar80._8_4_;
            auVar47._12_4_ = auVar77._12_4_ * auVar80._12_4_;
            auVar47._16_4_ = auVar80._16_4_ * 0.0;
            auVar47._20_4_ = auVar80._20_4_ * 0.0;
            auVar47._24_4_ = auVar80._24_4_ * 0.0;
            auVar47._28_4_ = auVar80._28_4_;
            auVar20 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar21),auVar95);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar89,ZEXT1632(auVar19));
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar75));
            uVar68 = vcmpps_avx512vl(auVar95,auVar89,2);
            bVar57 = (byte)uVar68;
            fVar118 = (float)((uint)(bVar57 & 1) * auVar76._0_4_ |
                             (uint)!(bool)(bVar57 & 1) * auVar78._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            fVar120 = (float)((uint)bVar10 * auVar76._4_4_ | (uint)!bVar10 * auVar78._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            fVar123 = (float)((uint)bVar10 * auVar76._8_4_ | (uint)!bVar10 * auVar78._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            fVar124 = (float)((uint)bVar10 * auVar76._12_4_ | (uint)!bVar10 * auVar78._12_4_);
            auVar82 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar123,CONCAT44(fVar120,fVar118))));
            fVar119 = (float)((uint)(bVar57 & 1) * auVar16._0_4_ |
                             (uint)!(bool)(bVar57 & 1) * auVar25._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            fVar122 = (float)((uint)bVar10 * auVar16._4_4_ | (uint)!bVar10 * auVar25._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            fVar121 = (float)((uint)bVar10 * auVar16._8_4_ | (uint)!bVar10 * auVar25._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            fVar125 = (float)((uint)bVar10 * auVar16._12_4_ | (uint)!bVar10 * auVar25._12_4_);
            auVar85 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar121,CONCAT44(fVar122,fVar119))));
            auVar111._0_4_ =
                 (float)((uint)(bVar57 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar57 & 1) * auVar79._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar10 * auVar93._4_4_ | (uint)!bVar10 * auVar79._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar10 * auVar93._8_4_ | (uint)!bVar10 * auVar79._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar10 * auVar93._12_4_ | (uint)!bVar10 * auVar79._12_4_);
            fVar149 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar93._16_4_);
            auVar111._16_4_ = fVar149;
            fVar135 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar93._20_4_);
            auVar111._20_4_ = fVar135;
            fVar136 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar93._24_4_);
            auVar111._24_4_ = fVar136;
            iVar1 = (uint)(byte)(uVar68 >> 7) * auVar93._28_4_;
            auVar111._28_4_ = iVar1;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar21),auVar91);
            auVar112._0_4_ =
                 (uint)(bVar57 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar75._0_4_;
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar75._4_4_;
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar75._8_4_;
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar75._12_4_;
            auVar112._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar95._16_4_;
            auVar112._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar95._20_4_;
            auVar112._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar95._24_4_;
            auVar112._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar95._28_4_;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar17));
            auVar113._0_4_ =
                 (float)((uint)(bVar57 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar57 & 1) * auVar76._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar76._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar76._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar76._12_4_);
            fVar137 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar95._16_4_);
            auVar113._16_4_ = fVar137;
            fVar167 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar95._20_4_);
            auVar113._20_4_ = fVar167;
            fVar170 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar95._24_4_);
            auVar113._24_4_ = fVar170;
            auVar113._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar95._28_4_;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar26),ZEXT1632(auVar18));
            auVar114._0_4_ =
                 (float)((uint)(bVar57 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar57 & 1) * auVar16._0_4_);
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar16._4_4_);
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar16._8_4_);
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar16._12_4_);
            fVar117 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar95._16_4_);
            auVar114._16_4_ = fVar117;
            fVar70 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar95._20_4_);
            auVar114._20_4_ = fVar70;
            fVar69 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar95._24_4_);
            auVar114._24_4_ = fVar69;
            iVar2 = (uint)(byte)(uVar68 >> 7) * auVar95._28_4_;
            auVar114._28_4_ = iVar2;
            auVar115._0_4_ =
                 (uint)(bVar57 & 1) * (int)auVar21._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar91._0_4_
            ;
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar10 * (int)auVar21._4_4_ | (uint)!bVar10 * auVar91._4_4_;
            bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar10 * (int)auVar21._8_4_ | (uint)!bVar10 * auVar91._8_4_;
            bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar10 * (int)auVar21._12_4_ | (uint)!bVar10 * auVar91._12_4_;
            auVar115._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar91._16_4_;
            auVar115._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar91._20_4_;
            auVar115._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar91._24_4_;
            auVar115._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar91._28_4_;
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar68 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar68 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar91 = vsubps_avx512vl(auVar115,auVar82);
            auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar77._12_4_ |
                                                    (uint)!bVar14 * auVar17._12_4_,
                                                    CONCAT48((uint)bVar12 * (int)auVar77._8_4_ |
                                                             (uint)!bVar12 * auVar17._8_4_,
                                                             CONCAT44((uint)bVar10 *
                                                                      (int)auVar77._4_4_ |
                                                                      (uint)!bVar10 * auVar17._4_4_,
                                                                      (uint)(bVar57 & 1) *
                                                                      (int)auVar77._0_4_ |
                                                                      (uint)!(bool)(bVar57 & 1) *
                                                                      auVar17._0_4_)))),auVar85);
            auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar26._12_4_ |
                                                    (uint)!bVar15 * auVar18._12_4_,
                                                    CONCAT48((uint)bVar13 * (int)auVar26._8_4_ |
                                                             (uint)!bVar13 * auVar18._8_4_,
                                                             CONCAT44((uint)bVar11 *
                                                                      (int)auVar26._4_4_ |
                                                                      (uint)!bVar11 * auVar18._4_4_,
                                                                      (uint)(bVar57 & 1) *
                                                                      (int)auVar26._0_4_ |
                                                                      (uint)!(bool)(bVar57 & 1) *
                                                                      auVar18._0_4_)))),auVar111);
            auVar92 = vsubps_avx(auVar82,auVar112);
            auVar80 = vsubps_avx(auVar85,auVar113);
            auVar81 = vsubps_avx(auVar111,auVar114);
            auVar48._4_4_ = auVar93._4_4_ * fVar120;
            auVar48._0_4_ = auVar93._0_4_ * fVar118;
            auVar48._8_4_ = auVar93._8_4_ * fVar123;
            auVar48._12_4_ = auVar93._12_4_ * fVar124;
            auVar48._16_4_ = auVar93._16_4_ * 0.0;
            auVar48._20_4_ = auVar93._20_4_ * 0.0;
            auVar48._24_4_ = auVar93._24_4_ * 0.0;
            auVar48._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar48,auVar111,auVar91);
            auVar155._0_4_ = fVar119 * auVar91._0_4_;
            auVar155._4_4_ = fVar122 * auVar91._4_4_;
            auVar155._8_4_ = fVar121 * auVar91._8_4_;
            auVar155._12_4_ = fVar125 * auVar91._12_4_;
            auVar155._16_4_ = auVar91._16_4_ * 0.0;
            auVar155._20_4_ = auVar91._20_4_ * 0.0;
            auVar155._24_4_ = auVar91._24_4_ * 0.0;
            auVar155._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar155,auVar82,auVar97);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar89,ZEXT1632(auVar75));
            auVar160._0_4_ = auVar97._0_4_ * auVar111._0_4_;
            auVar160._4_4_ = auVar97._4_4_ * auVar111._4_4_;
            auVar160._8_4_ = auVar97._8_4_ * auVar111._8_4_;
            auVar160._12_4_ = auVar97._12_4_ * auVar111._12_4_;
            auVar160._16_4_ = auVar97._16_4_ * fVar149;
            auVar160._20_4_ = auVar97._20_4_ * fVar135;
            auVar160._24_4_ = auVar97._24_4_ * fVar136;
            auVar160._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar160,auVar85,auVar93);
            auVar83 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar75));
            auVar95 = vmulps_avx512vl(auVar81,auVar112);
            auVar95 = vfmsub231ps_avx512vl(auVar95,auVar92,auVar114);
            auVar49._4_4_ = auVar80._4_4_ * auVar114._4_4_;
            auVar49._0_4_ = auVar80._0_4_ * auVar114._0_4_;
            auVar49._8_4_ = auVar80._8_4_ * auVar114._8_4_;
            auVar49._12_4_ = auVar80._12_4_ * auVar114._12_4_;
            auVar49._16_4_ = auVar80._16_4_ * fVar117;
            auVar49._20_4_ = auVar80._20_4_ * fVar70;
            auVar49._24_4_ = auVar80._24_4_ * fVar69;
            auVar49._28_4_ = iVar2;
            auVar75 = vfmsub231ps_fma(auVar49,auVar113,auVar81);
            auVar161._0_4_ = auVar113._0_4_ * auVar92._0_4_;
            auVar161._4_4_ = auVar113._4_4_ * auVar92._4_4_;
            auVar161._8_4_ = auVar113._8_4_ * auVar92._8_4_;
            auVar161._12_4_ = auVar113._12_4_ * auVar92._12_4_;
            auVar161._16_4_ = fVar137 * auVar92._16_4_;
            auVar161._20_4_ = fVar167 * auVar92._20_4_;
            auVar161._24_4_ = fVar170 * auVar92._24_4_;
            auVar161._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar161,auVar80,auVar112);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar89,auVar95);
            auVar84 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar75));
            auVar95 = vmaxps_avx(auVar83,auVar84);
            uVar138 = vcmpps_avx512vl(auVar95,auVar89,2);
            bVar66 = bVar66 & (byte)uVar138;
            if (bVar66 != 0) {
              uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar183._4_4_ = uVar126;
              auVar183._0_4_ = uVar126;
              auVar183._8_4_ = uVar126;
              auVar183._12_4_ = uVar126;
              auVar183._16_4_ = uVar126;
              auVar183._20_4_ = uVar126;
              auVar183._24_4_ = uVar126;
              auVar183._28_4_ = uVar126;
              auVar188 = ZEXT3264(auVar183);
              auVar50._4_4_ = auVar81._4_4_ * auVar97._4_4_;
              auVar50._0_4_ = auVar81._0_4_ * auVar97._0_4_;
              auVar50._8_4_ = auVar81._8_4_ * auVar97._8_4_;
              auVar50._12_4_ = auVar81._12_4_ * auVar97._12_4_;
              auVar50._16_4_ = auVar81._16_4_ * auVar97._16_4_;
              auVar50._20_4_ = auVar81._20_4_ * auVar97._20_4_;
              auVar50._24_4_ = auVar81._24_4_ * auVar97._24_4_;
              auVar50._28_4_ = auVar95._28_4_;
              auVar16 = vfmsub231ps_fma(auVar50,auVar80,auVar93);
              auVar51._4_4_ = auVar93._4_4_ * auVar92._4_4_;
              auVar51._0_4_ = auVar93._0_4_ * auVar92._0_4_;
              auVar51._8_4_ = auVar93._8_4_ * auVar92._8_4_;
              auVar51._12_4_ = auVar93._12_4_ * auVar92._12_4_;
              auVar51._16_4_ = auVar93._16_4_ * auVar92._16_4_;
              auVar51._20_4_ = auVar93._20_4_ * auVar92._20_4_;
              auVar51._24_4_ = auVar93._24_4_ * auVar92._24_4_;
              auVar51._28_4_ = auVar93._28_4_;
              auVar76 = vfmsub231ps_fma(auVar51,auVar91,auVar81);
              auVar52._4_4_ = auVar80._4_4_ * auVar91._4_4_;
              auVar52._0_4_ = auVar80._0_4_ * auVar91._0_4_;
              auVar52._8_4_ = auVar80._8_4_ * auVar91._8_4_;
              auVar52._12_4_ = auVar80._12_4_ * auVar91._12_4_;
              auVar52._16_4_ = auVar80._16_4_ * auVar91._16_4_;
              auVar52._20_4_ = auVar80._20_4_ * auVar91._20_4_;
              auVar52._24_4_ = auVar80._24_4_ * auVar91._24_4_;
              auVar52._28_4_ = auVar80._28_4_;
              auVar17 = vfmsub231ps_fma(auVar52,auVar92,auVar97);
              auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar17));
              auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar16),auVar89);
              auVar97 = vrcp14ps_avx512vl(auVar95);
              auVar92 = auVar192._0_32_;
              auVar93 = vfnmadd213ps_avx512vl(auVar97,auVar95,auVar92);
              auVar75 = vfmadd132ps_fma(auVar93,auVar97,auVar97);
              auVar53._4_4_ = auVar17._4_4_ * auVar111._4_4_;
              auVar53._0_4_ = auVar17._0_4_ * auVar111._0_4_;
              auVar53._8_4_ = auVar17._8_4_ * auVar111._8_4_;
              auVar53._12_4_ = auVar17._12_4_ * auVar111._12_4_;
              auVar53._16_4_ = fVar149 * 0.0;
              auVar53._20_4_ = fVar135 * 0.0;
              auVar53._24_4_ = fVar136 * 0.0;
              auVar53._28_4_ = iVar1;
              auVar76 = vfmadd231ps_fma(auVar53,auVar85,ZEXT1632(auVar76));
              auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar82,ZEXT1632(auVar16));
              fVar149 = auVar75._0_4_;
              fVar135 = auVar75._4_4_;
              fVar136 = auVar75._8_4_;
              fVar137 = auVar75._12_4_;
              local_240 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar137,
                                             CONCAT48(auVar76._8_4_ * fVar136,
                                                      CONCAT44(auVar76._4_4_ * fVar135,
                                                               auVar76._0_4_ * fVar149))));
              uVar138 = vcmpps_avx512vl(local_240,auVar183,2);
              auVar55._4_4_ = uStack_39c;
              auVar55._0_4_ = local_3a0;
              auVar55._8_4_ = uStack_398;
              auVar55._12_4_ = uStack_394;
              auVar55._16_4_ = uStack_390;
              auVar55._20_4_ = uStack_38c;
              auVar55._24_4_ = uStack_388;
              auVar55._28_4_ = uStack_384;
              uVar22 = vcmpps_avx512vl(local_240,auVar55,0xd);
              bVar66 = (byte)uVar138 & (byte)uVar22 & bVar66;
              if (bVar66 != 0) {
                uVar138 = vcmpps_avx512vl(auVar95,auVar89,4);
                bVar66 = bVar66 & (byte)uVar138;
                auVar191 = ZEXT3264(local_580);
                auVar184 = ZEXT3264(local_5a0);
                if (bVar66 != 0) {
                  fVar167 = auVar83._0_4_ * fVar149;
                  fVar170 = auVar83._4_4_ * fVar135;
                  auVar54._4_4_ = fVar170;
                  auVar54._0_4_ = fVar167;
                  fVar69 = auVar83._8_4_ * fVar136;
                  auVar54._8_4_ = fVar69;
                  fVar70 = auVar83._12_4_ * fVar137;
                  auVar54._12_4_ = fVar70;
                  fVar117 = auVar83._16_4_ * 0.0;
                  auVar54._16_4_ = fVar117;
                  fVar118 = auVar83._20_4_ * 0.0;
                  auVar54._20_4_ = fVar118;
                  fVar119 = auVar83._24_4_ * 0.0;
                  auVar54._24_4_ = fVar119;
                  auVar54._28_4_ = auVar95._28_4_;
                  auVar97 = vsubps_avx512vl(auVar92,auVar54);
                  local_280._0_4_ =
                       (float)((uint)(bVar57 & 1) * (int)fVar167 |
                              (uint)!(bool)(bVar57 & 1) * auVar97._0_4_);
                  bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
                  local_280._4_4_ =
                       (float)((uint)bVar10 * (int)fVar170 | (uint)!bVar10 * auVar97._4_4_);
                  bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                  local_280._8_4_ =
                       (float)((uint)bVar10 * (int)fVar69 | (uint)!bVar10 * auVar97._8_4_);
                  bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
                  local_280._12_4_ =
                       (float)((uint)bVar10 * (int)fVar70 | (uint)!bVar10 * auVar97._12_4_);
                  bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
                  local_280._16_4_ =
                       (float)((uint)bVar10 * (int)fVar117 | (uint)!bVar10 * auVar97._16_4_);
                  bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
                  local_280._20_4_ =
                       (float)((uint)bVar10 * (int)fVar118 | (uint)!bVar10 * auVar97._20_4_);
                  bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
                  local_280._24_4_ =
                       (float)((uint)bVar10 * (int)fVar119 | (uint)!bVar10 * auVar97._24_4_);
                  bVar10 = SUB81(uVar68 >> 7,0);
                  local_280._28_4_ =
                       (float)((uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar97._28_4_);
                  auVar95 = vsubps_avx(ZEXT1632(auVar74),auVar86);
                  auVar75 = vfmadd213ps_fma(auVar95,local_280,auVar86);
                  uVar126 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
                  auVar30._4_4_ = uVar126;
                  auVar30._0_4_ = uVar126;
                  auVar30._8_4_ = uVar126;
                  auVar30._12_4_ = uVar126;
                  auVar30._16_4_ = uVar126;
                  auVar30._20_4_ = uVar126;
                  auVar30._24_4_ = uVar126;
                  auVar30._28_4_ = uVar126;
                  auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                                               CONCAT48(auVar75._8_4_ +
                                                                        auVar75._8_4_,
                                                                        CONCAT44(auVar75._4_4_ +
                                                                                 auVar75._4_4_,
                                                                                 auVar75._0_4_ +
                                                                                 auVar75._0_4_)))),
                                            auVar30);
                  uVar138 = vcmpps_avx512vl(local_240,auVar95,6);
                  if (((byte)uVar138 & bVar66) != 0) {
                    auVar143._0_4_ = auVar84._0_4_ * fVar149;
                    auVar143._4_4_ = auVar84._4_4_ * fVar135;
                    auVar143._8_4_ = auVar84._8_4_ * fVar136;
                    auVar143._12_4_ = auVar84._12_4_ * fVar137;
                    auVar143._16_4_ = auVar84._16_4_ * 0.0;
                    auVar143._20_4_ = auVar84._20_4_ * 0.0;
                    auVar143._24_4_ = auVar84._24_4_ * 0.0;
                    auVar143._28_4_ = 0;
                    auVar95 = vsubps_avx512vl(auVar92,auVar143);
                    auVar116._0_4_ =
                         (uint)(bVar57 & 1) * (int)auVar143._0_4_ |
                         (uint)!(bool)(bVar57 & 1) * auVar95._0_4_;
                    bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
                    auVar116._4_4_ =
                         (uint)bVar10 * (int)auVar143._4_4_ | (uint)!bVar10 * auVar95._4_4_;
                    bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                    auVar116._8_4_ =
                         (uint)bVar10 * (int)auVar143._8_4_ | (uint)!bVar10 * auVar95._8_4_;
                    bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
                    auVar116._12_4_ =
                         (uint)bVar10 * (int)auVar143._12_4_ | (uint)!bVar10 * auVar95._12_4_;
                    bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
                    auVar116._16_4_ =
                         (uint)bVar10 * (int)auVar143._16_4_ | (uint)!bVar10 * auVar95._16_4_;
                    bVar10 = (bool)((byte)(uVar68 >> 5) & 1);
                    auVar116._20_4_ =
                         (uint)bVar10 * (int)auVar143._20_4_ | (uint)!bVar10 * auVar95._20_4_;
                    bVar10 = (bool)((byte)(uVar68 >> 6) & 1);
                    auVar116._24_4_ =
                         (uint)bVar10 * (int)auVar143._24_4_ | (uint)!bVar10 * auVar95._24_4_;
                    auVar116._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar95._28_4_;
                    auVar31._8_4_ = 0x40000000;
                    auVar31._0_8_ = 0x4000000040000000;
                    auVar31._12_4_ = 0x40000000;
                    auVar31._16_4_ = 0x40000000;
                    auVar31._20_4_ = 0x40000000;
                    auVar31._24_4_ = 0x40000000;
                    auVar31._28_4_ = 0x40000000;
                    local_260 = vfmsub132ps_avx512vl(auVar116,auVar92,auVar31);
                    local_220 = (undefined4)lVar64;
                    local_210 = local_510._0_8_;
                    uStack_208 = local_510._8_8_;
                    local_200 = local_520._0_8_;
                    uStack_1f8 = local_520._8_8_;
                    local_1f0 = local_530._0_8_;
                    uStack_1e8 = local_530._8_8_;
                    pGVar62 = (context->scene->geometries).items[local_5f8].ptr;
                    if ((pGVar62->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar57 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar57 = 1, pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar75 = vcvtsi2ss_avx512f(auVar190._0_16_,local_220);
                      fVar149 = auVar75._0_4_;
                      local_1c0[0] = (fVar149 + local_280._0_4_ + 0.0) * (float)local_2c0._0_4_;
                      local_1c0[1] = (fVar149 + local_280._4_4_ + 1.0) * (float)local_2c0._4_4_;
                      local_1c0[2] = (fVar149 + local_280._8_4_ + 2.0) * fStack_2b8;
                      local_1c0[3] = (fVar149 + local_280._12_4_ + 3.0) * fStack_2b4;
                      fStack_1b0 = (fVar149 + local_280._16_4_ + 4.0) * fStack_2b0;
                      fStack_1ac = (fVar149 + local_280._20_4_ + 5.0) * fStack_2ac;
                      fStack_1a8 = (fVar149 + local_280._24_4_ + 6.0) * fStack_2a8;
                      fStack_1a4 = fVar149 + local_280._28_4_ + 7.0;
                      local_1a0 = local_260;
                      local_180 = local_240;
                      lVar58 = 0;
                      uVar67 = (ulong)((byte)uVar138 & bVar66);
                      for (uVar68 = uVar67; (uVar68 & 1) == 0;
                          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        lVar58 = lVar58 + 1;
                      }
                      local_400._0_4_ = (int)uVar60;
                      local_160 = auVar183;
                      local_5e0 = pGVar62;
                      local_21c = iVar7;
                      do {
                        auVar76 = auVar195._0_16_;
                        local_320 = local_1c0[lVar58];
                        local_4a0._0_8_ = lVar58;
                        local_310 = *(undefined4 *)(local_1a0 + lVar58 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + lVar58 * 4);
                        local_5d0.context = context->user;
                        fVar135 = 1.0 - local_320;
                        fVar149 = fVar135 * fVar135 * -3.0;
                        auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                                  ZEXT416((uint)(local_320 * fVar135)),
                                                  ZEXT416(0xc0000000));
                        auVar74 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar135)),
                                                  ZEXT416((uint)(local_320 * local_320)),
                                                  ZEXT416(0x40000000));
                        fVar135 = auVar75._0_4_ * 3.0;
                        fVar136 = auVar74._0_4_ * 3.0;
                        fVar137 = local_320 * local_320 * 3.0;
                        auVar166._0_4_ = fVar137 * (float)local_3b0._0_4_;
                        auVar166._4_4_ = fVar137 * (float)local_3b0._4_4_;
                        auVar166._8_4_ = fVar137 * fStack_3a8;
                        auVar166._12_4_ = fVar137 * fStack_3a4;
                        auVar133._4_4_ = fVar136;
                        auVar133._0_4_ = fVar136;
                        auVar133._8_4_ = fVar136;
                        auVar133._12_4_ = fVar136;
                        auVar75 = vfmadd132ps_fma(auVar133,auVar166,local_530);
                        auVar153._4_4_ = fVar135;
                        auVar153._0_4_ = fVar135;
                        auVar153._8_4_ = fVar135;
                        auVar153._12_4_ = fVar135;
                        auVar75 = vfmadd132ps_fma(auVar153,auVar75,local_520);
                        auVar134._4_4_ = fVar149;
                        auVar134._0_4_ = fVar149;
                        auVar134._8_4_ = fVar149;
                        auVar134._12_4_ = fVar149;
                        auVar75 = vfmadd132ps_fma(auVar134,auVar75,local_510);
                        local_350 = auVar75._0_4_;
                        local_340 = vshufps_avx(auVar75,auVar75,0x55);
                        local_330 = vshufps_avx(auVar75,auVar75,0xaa);
                        local_300 = local_540._0_8_;
                        uStack_2f8 = local_540._8_8_;
                        local_2f0 = local_550;
                        vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                        uStack_2dc = (local_5d0.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_5d0.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_610 = local_3c0;
                        local_5d0.valid = (int *)local_610;
                        local_5d0.geometryUserPtr = pGVar62->userPtr;
                        local_5d0.hit = (RTCHitN *)&local_350;
                        local_5d0.N = 4;
                        local_5f0._0_8_ = uVar67;
                        local_5d0.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        fStack_31c = local_320;
                        fStack_318 = local_320;
                        fStack_314 = local_320;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar62->occlusionFilterN)(&local_5d0);
                          auVar188 = ZEXT3264(local_160);
                          uVar60 = (ulong)(uint)local_400._0_4_;
                          auVar198 = ZEXT3264(local_440);
                          auVar184 = ZEXT3264(local_5a0);
                          auVar191 = ZEXT3264(local_580);
                          auVar194 = ZEXT3264(local_3e0);
                          auVar193 = ZEXT3264(local_420);
                          auVar75 = vxorps_avx512vl(auVar76,auVar76);
                          auVar195 = ZEXT1664(auVar75);
                          pGVar62 = local_5e0;
                          uVar67 = local_5f0._0_8_;
                        }
                        auVar75 = auVar195._0_16_;
                        uVar68 = vptestmd_avx512vl(local_610,local_610);
                        if ((uVar68 & 0xf) == 0) {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar95);
                          auVar196 = ZEXT3264(local_4c0);
                          auVar197 = ZEXT3264(local_4e0);
                          auVar199 = ZEXT3264(local_500);
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar62->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_5d0);
                            auVar188 = ZEXT3264(local_160);
                            uVar60 = (ulong)(uint)local_400._0_4_;
                            auVar198 = ZEXT3264(local_440);
                            auVar184 = ZEXT3264(local_5a0);
                            auVar191 = ZEXT3264(local_580);
                            auVar194 = ZEXT3264(local_3e0);
                            auVar193 = ZEXT3264(local_420);
                            auVar75 = vxorps_avx512vl(auVar75,auVar75);
                            auVar195 = ZEXT1664(auVar75);
                            pGVar62 = local_5e0;
                            uVar67 = local_5f0._0_8_;
                          }
                          uVar68 = vptestmd_avx512vl(local_610,local_610);
                          uVar68 = uVar68 & 0xf;
                          auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar10 = (bool)((byte)uVar68 & 1);
                          bVar11 = (bool)((byte)(uVar68 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
                          bVar13 = SUB81(uVar68 >> 3,0);
                          *(uint *)(local_5d0.ray + 0x80) =
                               (uint)bVar10 * auVar75._0_4_ |
                               (uint)!bVar10 * *(int *)(local_5d0.ray + 0x80);
                          *(uint *)(local_5d0.ray + 0x84) =
                               (uint)bVar11 * auVar75._4_4_ |
                               (uint)!bVar11 * *(int *)(local_5d0.ray + 0x84);
                          *(uint *)(local_5d0.ray + 0x88) =
                               (uint)bVar12 * auVar75._8_4_ |
                               (uint)!bVar12 * *(int *)(local_5d0.ray + 0x88);
                          *(uint *)(local_5d0.ray + 0x8c) =
                               (uint)bVar13 * auVar75._12_4_ |
                               (uint)!bVar13 * *(int *)(local_5d0.ray + 0x8c);
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar95);
                          auVar196 = ZEXT3264(local_4c0);
                          auVar197 = ZEXT3264(local_4e0);
                          auVar199 = ZEXT3264(local_500);
                          if ((byte)uVar68 != 0) {
                            bVar57 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar188._0_4_;
                        bVar57 = 0;
                        lVar58 = 0;
                        uVar67 = uVar67 ^ 1L << (local_4a0._0_8_ & 0x3f);
                        for (uVar68 = uVar67; (uVar68 & 1) == 0;
                            uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                          lVar58 = lVar58 + 1;
                        }
                      } while (uVar67 != 0);
                    }
                    uVar60 = CONCAT71((int7)(uVar60 >> 8),(byte)uVar60 | bVar57);
                  }
                }
                goto LAB_01b7ec3f;
              }
            }
            auVar191 = ZEXT3264(local_580);
            auVar184 = ZEXT3264(local_5a0);
          }
LAB_01b7ec3f:
          lVar64 = lVar64 + 8;
          auVar190 = auVar184;
        } while ((int)lVar64 < iVar7);
      }
      bVar66 = (byte)uVar60;
      if ((uVar60 & 1) != 0) break;
      uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar28._4_4_ = uVar126;
      auVar28._0_4_ = uVar126;
      auVar28._8_4_ = uVar126;
      auVar28._12_4_ = uVar126;
      uVar138 = vcmpps_avx512vl(local_290,auVar28,2);
      uVar63 = (uint)uVar65 & (uint)uVar65 + 0xf & (uint)uVar138;
      uVar65 = (ulong)uVar63;
    } while (uVar63 != 0);
  }
  return (bool)(bVar66 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }